

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx512::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  int iVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  long lVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  byte bVar72;
  ulong uVar73;
  uint uVar74;
  uint uVar75;
  ulong uVar76;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar84;
  undefined1 auVar93 [16];
  long lVar77;
  uint uVar78;
  ulong uVar79;
  size_t sVar80;
  byte bVar81;
  ulong uVar82;
  float fVar83;
  float fVar135;
  float fVar137;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar90 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar91 [16];
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar92 [16];
  float fVar141;
  float fVar142;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar143;
  undefined4 uVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined8 uVar163;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar168;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar169;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar178;
  float fVar179;
  float fVar183;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar203 [64];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [16];
  size_t local_610;
  undefined1 (*local_608) [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined4 uStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined1 local_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar221 [64];
  
  PVar8 = prim[1];
  uVar82 = (ulong)(byte)PVar8;
  lVar66 = uVar82 * 0x19;
  fVar169 = *(float *)(prim + lVar66 + 0x12);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar170 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar171 = vsubps_avx(auVar85,*(undefined1 (*) [16])(prim + lVar66 + 6));
  fVar178 = fVar169 * auVar171._0_4_;
  fVar143 = fVar169 * auVar170._0_4_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar82 * 4 + 6);
  auVar100 = vpmovsxbd_avx2(auVar85);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar82 * 5 + 6);
  auVar97 = vpmovsxbd_avx2(auVar20);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar82 * 6 + 6);
  auVar98 = vpmovsxbd_avx2(auVar6);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar82 * 0xb + 6);
  auVar99 = vpmovsxbd_avx2(auVar93);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar104 = vpmovsxbd_avx2(auVar88);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar102 = vcvtdq2ps_avx(auVar104);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar82 + 6);
  auVar101 = vpmovsxbd_avx2(auVar89);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar79 = (ulong)(uint)((int)(uVar82 * 9) * 2);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar79 + 6);
  auVar109 = vpmovsxbd_avx2(auVar87);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar79 + uVar82 + 6);
  auVar108 = vpmovsxbd_avx2(auVar86);
  auVar108 = vcvtdq2ps_avx(auVar108);
  uVar73 = (ulong)(uint)((int)(uVar82 * 5) << 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar96 = vpmovsxbd_avx2(auVar7);
  auVar103 = vcvtdq2ps_avx(auVar96);
  auVar214._4_4_ = fVar143;
  auVar214._0_4_ = fVar143;
  auVar214._8_4_ = fVar143;
  auVar214._12_4_ = fVar143;
  auVar214._16_4_ = fVar143;
  auVar214._20_4_ = fVar143;
  auVar214._24_4_ = fVar143;
  auVar214._28_4_ = fVar143;
  auVar216._8_4_ = 1;
  auVar216._0_8_ = 0x100000001;
  auVar216._12_4_ = 1;
  auVar216._16_4_ = 1;
  auVar216._20_4_ = 1;
  auVar216._24_4_ = 1;
  auVar216._28_4_ = 1;
  auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar106 = ZEXT1632(CONCAT412(fVar169 * auVar170._12_4_,
                                CONCAT48(fVar169 * auVar170._8_4_,
                                         CONCAT44(fVar169 * auVar170._4_4_,fVar143))));
  auVar105 = vpermps_avx2(auVar216,auVar106);
  auVar95 = vpermps_avx512vl(auVar94,auVar106);
  fVar143 = auVar95._0_4_;
  fVar158 = auVar95._4_4_;
  auVar106._4_4_ = fVar158 * auVar98._4_4_;
  auVar106._0_4_ = fVar143 * auVar98._0_4_;
  fVar159 = auVar95._8_4_;
  auVar106._8_4_ = fVar159 * auVar98._8_4_;
  fVar160 = auVar95._12_4_;
  auVar106._12_4_ = fVar160 * auVar98._12_4_;
  fVar168 = auVar95._16_4_;
  auVar106._16_4_ = fVar168 * auVar98._16_4_;
  fVar161 = auVar95._20_4_;
  auVar106._20_4_ = fVar161 * auVar98._20_4_;
  fVar162 = auVar95._24_4_;
  auVar106._24_4_ = fVar162 * auVar98._24_4_;
  auVar106._28_4_ = auVar104._28_4_;
  auVar104._4_4_ = auVar101._4_4_ * fVar158;
  auVar104._0_4_ = auVar101._0_4_ * fVar143;
  auVar104._8_4_ = auVar101._8_4_ * fVar159;
  auVar104._12_4_ = auVar101._12_4_ * fVar160;
  auVar104._16_4_ = auVar101._16_4_ * fVar168;
  auVar104._20_4_ = auVar101._20_4_ * fVar161;
  auVar104._24_4_ = auVar101._24_4_ * fVar162;
  auVar104._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar103._4_4_ * fVar158;
  auVar96._0_4_ = auVar103._0_4_ * fVar143;
  auVar96._8_4_ = auVar103._8_4_ * fVar159;
  auVar96._12_4_ = auVar103._12_4_ * fVar160;
  auVar96._16_4_ = auVar103._16_4_ * fVar168;
  auVar96._20_4_ = auVar103._20_4_ * fVar161;
  auVar96._24_4_ = auVar103._24_4_ * fVar162;
  auVar96._28_4_ = auVar95._28_4_;
  auVar85 = vfmadd231ps_fma(auVar106,auVar105,auVar97);
  auVar20 = vfmadd231ps_fma(auVar104,auVar105,auVar102);
  auVar6 = vfmadd231ps_fma(auVar96,auVar108,auVar105);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar214,auVar100);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar214,auVar99);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar109,auVar214);
  auVar215._4_4_ = fVar178;
  auVar215._0_4_ = fVar178;
  auVar215._8_4_ = fVar178;
  auVar215._12_4_ = fVar178;
  auVar215._16_4_ = fVar178;
  auVar215._20_4_ = fVar178;
  auVar215._24_4_ = fVar178;
  auVar215._28_4_ = fVar178;
  auVar96 = ZEXT1632(CONCAT412(fVar169 * auVar171._12_4_,
                               CONCAT48(fVar169 * auVar171._8_4_,
                                        CONCAT44(fVar169 * auVar171._4_4_,fVar178))));
  auVar104 = vpermps_avx2(auVar216,auVar96);
  auVar96 = vpermps_avx512vl(auVar94,auVar96);
  fVar169 = auVar96._0_4_;
  fVar143 = auVar96._4_4_;
  auVar105._4_4_ = fVar143 * auVar98._4_4_;
  auVar105._0_4_ = fVar169 * auVar98._0_4_;
  fVar158 = auVar96._8_4_;
  auVar105._8_4_ = fVar158 * auVar98._8_4_;
  fVar159 = auVar96._12_4_;
  auVar105._12_4_ = fVar159 * auVar98._12_4_;
  fVar160 = auVar96._16_4_;
  auVar105._16_4_ = fVar160 * auVar98._16_4_;
  fVar168 = auVar96._20_4_;
  auVar105._20_4_ = fVar168 * auVar98._20_4_;
  fVar161 = auVar96._24_4_;
  auVar105._24_4_ = fVar161 * auVar98._24_4_;
  auVar105._28_4_ = 1;
  auVar94._4_4_ = auVar101._4_4_ * fVar143;
  auVar94._0_4_ = auVar101._0_4_ * fVar169;
  auVar94._8_4_ = auVar101._8_4_ * fVar158;
  auVar94._12_4_ = auVar101._12_4_ * fVar159;
  auVar94._16_4_ = auVar101._16_4_ * fVar160;
  auVar94._20_4_ = auVar101._20_4_ * fVar168;
  auVar94._24_4_ = auVar101._24_4_ * fVar161;
  auVar94._28_4_ = auVar98._28_4_;
  auVar101._4_4_ = auVar103._4_4_ * fVar143;
  auVar101._0_4_ = auVar103._0_4_ * fVar169;
  auVar101._8_4_ = auVar103._8_4_ * fVar158;
  auVar101._12_4_ = auVar103._12_4_ * fVar159;
  auVar101._16_4_ = auVar103._16_4_ * fVar160;
  auVar101._20_4_ = auVar103._20_4_ * fVar168;
  auVar101._24_4_ = auVar103._24_4_ * fVar161;
  auVar101._28_4_ = auVar96._28_4_;
  auVar93 = vfmadd231ps_fma(auVar105,auVar104,auVar97);
  auVar88 = vfmadd231ps_fma(auVar94,auVar104,auVar102);
  auVar89 = vfmadd231ps_fma(auVar101,auVar104,auVar108);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar215,auVar100);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar215,auVar99);
  auVar205._8_4_ = 0x7fffffff;
  auVar205._0_8_ = 0x7fffffff7fffffff;
  auVar205._12_4_ = 0x7fffffff;
  auVar205._16_4_ = 0x7fffffff;
  auVar205._20_4_ = 0x7fffffff;
  auVar205._24_4_ = 0x7fffffff;
  auVar205._28_4_ = 0x7fffffff;
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar215,auVar109);
  auVar100 = vandps_avx(ZEXT1632(auVar85),auVar205);
  auVar204._8_4_ = 0x219392ef;
  auVar204._0_8_ = 0x219392ef219392ef;
  auVar204._12_4_ = 0x219392ef;
  auVar204._16_4_ = 0x219392ef;
  auVar204._20_4_ = 0x219392ef;
  auVar204._24_4_ = 0x219392ef;
  auVar204._28_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar100,auVar204,1);
  bVar13 = (bool)((byte)uVar79 & 1);
  auVar95._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar85._0_4_;
  bVar13 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar85._4_4_;
  bVar13 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar85._8_4_;
  bVar13 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar85._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar20),auVar205);
  uVar79 = vcmpps_avx512vl(auVar100,auVar204,1);
  bVar13 = (bool)((byte)uVar79 & 1);
  auVar107._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar20._0_4_;
  bVar13 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar107._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar20._4_4_;
  bVar13 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar107._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar20._8_4_;
  bVar13 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar107._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar20._12_4_;
  auVar107._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar107._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar107._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar107._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar6),auVar205);
  uVar79 = vcmpps_avx512vl(auVar100,auVar204,1);
  bVar13 = (bool)((byte)uVar79 & 1);
  auVar100._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar6._0_4_;
  bVar13 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar6._4_4_;
  bVar13 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar6._8_4_;
  bVar13 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar6._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar97 = vrcp14ps_avx512vl(auVar95);
  auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar223 = ZEXT3264(auVar98);
  auVar99 = vfnmadd213ps_avx512vl(auVar95,auVar97,auVar98);
  auVar85 = vfmadd132ps_fma(auVar99,auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar107);
  auVar99 = vfnmadd213ps_avx512vl(auVar107,auVar97,auVar98);
  auVar20 = vfmadd132ps_fma(auVar99,auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar100);
  auVar100 = vfnmadd213ps_avx512vl(auVar100,auVar97,auVar98);
  auVar6 = vfmadd132ps_fma(auVar100,auVar97,auVar97);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 7 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar93));
  auVar109._4_4_ = auVar85._4_4_ * auVar100._4_4_;
  auVar109._0_4_ = auVar85._0_4_ * auVar100._0_4_;
  auVar109._8_4_ = auVar85._8_4_ * auVar100._8_4_;
  auVar109._12_4_ = auVar85._12_4_ * auVar100._12_4_;
  auVar109._16_4_ = auVar100._16_4_ * 0.0;
  auVar109._20_4_ = auVar100._20_4_ * 0.0;
  auVar109._24_4_ = auVar100._24_4_ * 0.0;
  auVar109._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 9 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar93));
  auVar101 = vpbroadcastd_avx512vl();
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar176._0_4_ = auVar85._0_4_ * auVar100._0_4_;
  auVar176._4_4_ = auVar85._4_4_ * auVar100._4_4_;
  auVar176._8_4_ = auVar85._8_4_ * auVar100._8_4_;
  auVar176._12_4_ = auVar85._12_4_ * auVar100._12_4_;
  auVar176._16_4_ = auVar100._16_4_ * 0.0;
  auVar176._20_4_ = auVar100._20_4_ * 0.0;
  auVar176._24_4_ = auVar100._24_4_ * 0.0;
  auVar176._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar8 * 0x10 + uVar82 * -2 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar88));
  auVar108._4_4_ = auVar20._4_4_ * auVar100._4_4_;
  auVar108._0_4_ = auVar20._0_4_ * auVar100._0_4_;
  auVar108._8_4_ = auVar20._8_4_ * auVar100._8_4_;
  auVar108._12_4_ = auVar20._12_4_ * auVar100._12_4_;
  auVar108._16_4_ = auVar100._16_4_ * 0.0;
  auVar108._20_4_ = auVar100._20_4_ * 0.0;
  auVar108._24_4_ = auVar100._24_4_ * 0.0;
  auVar108._28_4_ = auVar100._28_4_;
  auVar100 = vcvtdq2ps_avx(auVar97);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar88));
  auVar166._0_4_ = auVar20._0_4_ * auVar100._0_4_;
  auVar166._4_4_ = auVar20._4_4_ * auVar100._4_4_;
  auVar166._8_4_ = auVar20._8_4_ * auVar100._8_4_;
  auVar166._12_4_ = auVar20._12_4_ * auVar100._12_4_;
  auVar166._16_4_ = auVar100._16_4_ * 0.0;
  auVar166._20_4_ = auVar100._20_4_ * 0.0;
  auVar166._24_4_ = auVar100._24_4_ * 0.0;
  auVar166._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 + uVar82 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar89));
  auVar103._4_4_ = auVar100._4_4_ * auVar6._4_4_;
  auVar103._0_4_ = auVar100._0_4_ * auVar6._0_4_;
  auVar103._8_4_ = auVar100._8_4_ * auVar6._8_4_;
  auVar103._12_4_ = auVar100._12_4_ * auVar6._12_4_;
  auVar103._16_4_ = auVar100._16_4_ * 0.0;
  auVar103._20_4_ = auVar100._20_4_ * 0.0;
  auVar103._24_4_ = auVar100._24_4_ * 0.0;
  auVar103._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0x17 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar89));
  auVar149._0_4_ = auVar6._0_4_ * auVar100._0_4_;
  auVar149._4_4_ = auVar6._4_4_ * auVar100._4_4_;
  auVar149._8_4_ = auVar6._8_4_ * auVar100._8_4_;
  auVar149._12_4_ = auVar6._12_4_ * auVar100._12_4_;
  auVar149._16_4_ = auVar100._16_4_ * 0.0;
  auVar149._20_4_ = auVar100._20_4_ * 0.0;
  auVar149._24_4_ = auVar100._24_4_ * 0.0;
  auVar149._28_4_ = 0;
  auVar100 = vpminsd_avx2(auVar109,auVar176);
  auVar97 = vpminsd_avx2(auVar108,auVar166);
  auVar100 = vmaxps_avx(auVar100,auVar97);
  auVar97 = vpminsd_avx2(auVar103,auVar149);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar98._4_4_ = uVar3;
  auVar98._0_4_ = uVar3;
  auVar98._8_4_ = uVar3;
  auVar98._12_4_ = uVar3;
  auVar98._16_4_ = uVar3;
  auVar98._20_4_ = uVar3;
  auVar98._24_4_ = uVar3;
  auVar98._28_4_ = uVar3;
  auVar97 = vmaxps_avx512vl(auVar97,auVar98);
  auVar100 = vmaxps_avx(auVar100,auVar97);
  auVar97._8_4_ = 0x3f7ffffa;
  auVar97._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar97._12_4_ = 0x3f7ffffa;
  auVar97._16_4_ = 0x3f7ffffa;
  auVar97._20_4_ = 0x3f7ffffa;
  auVar97._24_4_ = 0x3f7ffffa;
  auVar97._28_4_ = 0x3f7ffffa;
  local_540 = vmulps_avx512vl(auVar100,auVar97);
  auVar224 = ZEXT3264(local_540);
  auVar100 = vpmaxsd_avx2(auVar109,auVar176);
  auVar97 = vpmaxsd_avx2(auVar108,auVar166);
  auVar100 = vminps_avx(auVar100,auVar97);
  auVar97 = vpmaxsd_avx2(auVar103,auVar149);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar99._4_4_ = uVar3;
  auVar99._0_4_ = uVar3;
  auVar99._8_4_ = uVar3;
  auVar99._12_4_ = uVar3;
  auVar99._16_4_ = uVar3;
  auVar99._20_4_ = uVar3;
  auVar99._24_4_ = uVar3;
  auVar99._28_4_ = uVar3;
  auVar97 = vminps_avx512vl(auVar97,auVar99);
  auVar100 = vminps_avx(auVar100,auVar97);
  auVar102._8_4_ = 0x3f800003;
  auVar102._0_8_ = 0x3f8000033f800003;
  auVar102._12_4_ = 0x3f800003;
  auVar102._16_4_ = 0x3f800003;
  auVar102._20_4_ = 0x3f800003;
  auVar102._24_4_ = 0x3f800003;
  auVar102._28_4_ = 0x3f800003;
  auVar100 = vmulps_avx512vl(auVar100,auVar102);
  uVar21 = vpcmpgtd_avx512vl(auVar101,_DAT_01fe9900);
  uVar163 = vcmpps_avx512vl(local_540,auVar100,2);
  if ((byte)((byte)uVar163 & (byte)uVar21) != 0) {
    uVar79 = (ulong)(byte)((byte)uVar163 & (byte)uVar21);
    local_608 = (undefined1 (*) [32])&local_140;
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar225 = ZEXT1664(auVar85);
    sVar80 = k;
    local_610 = k;
    do {
      lVar22 = 0;
      for (uVar73 = uVar79; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar79 = uVar79 - 1 & uVar79;
      uVar3 = *(undefined4 *)(prim + lVar22 * 4 + 6);
      uVar73 = (ulong)(uint)((int)lVar22 << 6);
      uVar78 = *(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[uVar78].ptr;
      auVar85 = *(undefined1 (*) [16])(prim + uVar73 + lVar66 + 0x16);
      if (uVar79 != 0) {
        uVar76 = uVar79 - 1 & uVar79;
        for (uVar82 = uVar79; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
        }
        if (uVar76 != 0) {
          for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar20 = *(undefined1 (*) [16])(prim + uVar73 + lVar66 + 0x26);
      auVar6 = *(undefined1 (*) [16])(prim + uVar73 + lVar66 + 0x36);
      auVar93 = *(undefined1 (*) [16])(prim + uVar73 + lVar66 + 0x46);
      iVar9 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar80 * 4)),
                              ZEXT416(*(uint *)(ray + sVar80 * 4 + 0x20)),0x1c);
      auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + sVar80 * 4 + 0x40)),0x28);
      auVar87 = vsubps_avx(auVar85,auVar88);
      uVar144 = auVar87._0_4_;
      auVar170._4_4_ = uVar144;
      auVar170._0_4_ = uVar144;
      auVar170._8_4_ = uVar144;
      auVar170._12_4_ = uVar144;
      auVar89 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar169 = pre->ray_space[k].vz.field_0.m128[0];
      fVar143 = pre->ray_space[k].vz.field_0.m128[1];
      fVar158 = pre->ray_space[k].vz.field_0.m128[2];
      fVar159 = pre->ray_space[k].vz.field_0.m128[3];
      auVar90._0_4_ = fVar169 * auVar87._0_4_;
      auVar90._4_4_ = fVar143 * auVar87._4_4_;
      auVar90._8_4_ = fVar158 * auVar87._8_4_;
      auVar90._12_4_ = fVar159 * auVar87._12_4_;
      auVar89 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar5,auVar89);
      auVar7 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar170);
      auVar89 = vshufps_avx(auVar85,auVar85,0xff);
      auVar86 = vsubps_avx(auVar20,auVar88);
      uVar144 = auVar86._0_4_;
      auVar180._4_4_ = uVar144;
      auVar180._0_4_ = uVar144;
      auVar180._8_4_ = uVar144;
      auVar180._12_4_ = uVar144;
      auVar87 = vshufps_avx(auVar86,auVar86,0x55);
      auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
      auVar207._0_4_ = fVar169 * auVar86._0_4_;
      auVar207._4_4_ = fVar143 * auVar86._4_4_;
      auVar207._8_4_ = fVar158 * auVar86._8_4_;
      auVar207._12_4_ = fVar159 * auVar86._12_4_;
      auVar87 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar5,auVar87);
      auVar170 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar4,auVar180);
      auVar86 = vsubps_avx512vl(auVar6,auVar88);
      uVar144 = auVar86._0_4_;
      auVar181._4_4_ = uVar144;
      auVar181._0_4_ = uVar144;
      auVar181._8_4_ = uVar144;
      auVar181._12_4_ = uVar144;
      auVar87 = vshufps_avx(auVar86,auVar86,0x55);
      auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
      auVar91._0_4_ = fVar169 * auVar86._0_4_;
      auVar91._4_4_ = fVar143 * auVar86._4_4_;
      auVar91._8_4_ = fVar158 * auVar86._8_4_;
      auVar91._12_4_ = fVar159 * auVar86._12_4_;
      auVar87 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar5,auVar87);
      auVar86 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar4,auVar181);
      auVar87 = vsubps_avx512vl(auVar93,auVar88);
      uVar144 = auVar87._0_4_;
      auVar171._4_4_ = uVar144;
      auVar171._0_4_ = uVar144;
      auVar171._8_4_ = uVar144;
      auVar171._12_4_ = uVar144;
      auVar88 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar92._0_4_ = fVar169 * auVar87._0_4_;
      auVar92._4_4_ = fVar143 * auVar87._4_4_;
      auVar92._8_4_ = fVar158 * auVar87._8_4_;
      auVar92._12_4_ = fVar159 * auVar87._12_4_;
      auVar88 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar5,auVar88);
      auVar87 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar4,auVar171);
      lVar22 = (long)iVar9 * 0x44;
      auVar100 = *(undefined1 (*) [32])(bspline_basis0 + lVar22);
      uVar144 = auVar7._0_4_;
      local_400._4_4_ = uVar144;
      local_400._0_4_ = uVar144;
      local_400._8_4_ = uVar144;
      local_400._12_4_ = uVar144;
      local_400._16_4_ = uVar144;
      local_400._20_4_ = uVar144;
      local_400._24_4_ = uVar144;
      local_400._28_4_ = uVar144;
      auVar150._8_4_ = 1;
      auVar150._0_8_ = 0x100000001;
      auVar150._12_4_ = 1;
      auVar150._16_4_ = 1;
      auVar150._20_4_ = 1;
      auVar150._24_4_ = 1;
      auVar150._28_4_ = 1;
      local_420 = vpermps_avx2(auVar150,ZEXT1632(auVar7));
      auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x484);
      local_440 = vbroadcastss_avx512vl(auVar170);
      local_460 = vpermps_avx512vl(auVar150,ZEXT1632(auVar170));
      auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x908);
      local_480 = vbroadcastss_avx512vl(auVar86);
      local_4a0 = vpermps_avx512vl(auVar150,ZEXT1632(auVar86));
      auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0xd8c);
      fVar168 = auVar87._0_4_;
      local_4c0._4_4_ = fVar168;
      local_4c0._0_4_ = fVar168;
      fStack_4b8 = fVar168;
      fStack_4b4 = fVar168;
      fStack_4b0 = fVar168;
      fStack_4ac = fVar168;
      fStack_4a8 = fVar168;
      register0x0000139c = fVar168;
      _local_4e0 = vpermps_avx512vl(auVar150,ZEXT1632(auVar87));
      auVar102 = vmulps_avx512vl(_local_4c0,auVar99);
      auVar101 = vmulps_avx512vl(_local_4e0,auVar99);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,local_480);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,local_4a0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,local_440);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_460);
      auVar103 = vfmadd231ps_avx512vl(auVar102,auVar100,local_400);
      auVar203 = ZEXT3264(auVar103);
      auVar104 = vfmadd231ps_avx512vl(auVar101,auVar100,local_420);
      auVar196 = ZEXT3264(auVar104);
      auVar102 = *(undefined1 (*) [32])(bspline_basis1 + lVar22);
      auVar101 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x484);
      auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x908);
      auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0xd8c);
      auVar96 = vmulps_avx512vl(_local_4c0,auVar108);
      auVar105 = vmulps_avx512vl(_local_4e0,auVar108);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_480);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar109,local_4a0);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar101,local_440);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar101,local_460);
      auVar171 = vfmadd231ps_fma(auVar96,auVar102,local_400);
      auVar206 = ZEXT1664(auVar171);
      auVar180 = vfmadd231ps_fma(auVar105,auVar102,local_420);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar171),auVar103);
      auVar105 = vsubps_avx512vl(ZEXT1632(auVar180),auVar104);
      auVar106 = vmulps_avx512vl(auVar104,auVar96);
      auVar94 = vmulps_avx512vl(auVar103,auVar105);
      auVar106 = vsubps_avx512vl(auVar106,auVar94);
      auVar88 = vshufps_avx(auVar20,auVar20,0xff);
      uVar163 = auVar89._0_8_;
      local_80._8_8_ = uVar163;
      local_80._0_8_ = uVar163;
      local_80._16_8_ = uVar163;
      local_80._24_8_ = uVar163;
      local_a0 = vbroadcastsd_avx512vl(auVar88);
      auVar88 = vshufps_avx512vl(auVar6,auVar6,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar88);
      auVar88 = vshufps_avx512vl(auVar93,auVar93,0xff);
      uVar163 = auVar88._0_8_;
      local_e0._8_8_ = uVar163;
      local_e0._0_8_ = uVar163;
      local_e0._16_8_ = uVar163;
      local_e0._24_8_ = uVar163;
      auVar94 = vmulps_avx512vl(local_e0,auVar99);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar98,local_c0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,local_a0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,local_80);
      auVar95 = vmulps_avx512vl(local_e0,auVar108);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,local_c0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,local_a0);
      auVar181 = vfmadd231ps_fma(auVar95,auVar102,local_80);
      auVar95 = vmulps_avx512vl(auVar105,auVar105);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar96,auVar96);
      auVar107 = vmaxps_avx512vl(auVar94,ZEXT1632(auVar181));
      auVar107 = vmulps_avx512vl(auVar107,auVar107);
      auVar95 = vmulps_avx512vl(auVar107,auVar95);
      auVar106 = vmulps_avx512vl(auVar106,auVar106);
      uVar163 = vcmpps_avx512vl(auVar106,auVar95,2);
      auVar88 = vblendps_avx(auVar7,auVar85,8);
      auVar207 = auVar225._0_16_;
      auVar89 = vandps_avx512vl(auVar88,auVar207);
      auVar88 = vblendps_avx(auVar170,auVar20,8);
      auVar88 = vandps_avx512vl(auVar88,auVar207);
      auVar89 = vmaxps_avx(auVar89,auVar88);
      auVar88 = vblendps_avx(auVar86,auVar6,8);
      auVar90 = vandps_avx512vl(auVar88,auVar207);
      auVar88 = vblendps_avx(auVar87,auVar93,8);
      auVar88 = vandps_avx512vl(auVar88,auVar207);
      auVar88 = vmaxps_avx(auVar90,auVar88);
      auVar88 = vmaxps_avx(auVar89,auVar88);
      auVar89 = vmovshdup_avx(auVar88);
      auVar89 = vmaxss_avx(auVar89,auVar88);
      auVar88 = vshufpd_avx(auVar88,auVar88,1);
      auVar88 = vmaxss_avx(auVar88,auVar89);
      local_620 = vcvtsi2ss_avx512f(auVar93,iVar9);
      auVar212._0_4_ = local_620._0_4_;
      auVar212._4_4_ = auVar212._0_4_;
      auVar212._8_4_ = auVar212._0_4_;
      auVar212._12_4_ = auVar212._0_4_;
      auVar212._16_4_ = auVar212._0_4_;
      auVar212._20_4_ = auVar212._0_4_;
      auVar212._24_4_ = auVar212._0_4_;
      auVar212._28_4_ = auVar212._0_4_;
      uVar21 = vcmpps_avx512vl(auVar212,_DAT_01faff40,0xe);
      bVar81 = (byte)uVar163 & (byte)uVar21;
      fVar169 = auVar88._0_4_ * 4.7683716e-07;
      auVar213._8_4_ = 2;
      auVar213._0_8_ = 0x200000002;
      auVar213._12_4_ = 2;
      auVar213._16_4_ = 2;
      auVar213._20_4_ = 2;
      auVar213._24_4_ = 2;
      auVar213._28_4_ = 2;
      auVar106 = vpermps_avx512vl(auVar213,ZEXT1632(auVar7));
      auVar222 = ZEXT3264(auVar106);
      local_240 = vpermps_avx2(auVar213,ZEXT1632(auVar170));
      local_260 = vpermps_avx2(auVar213,ZEXT1632(auVar86));
      local_280 = vpermps_avx2(auVar213,ZEXT1632(auVar87));
      uVar74 = *(uint *)(ray + sVar80 * 4 + 0x60);
      local_5a0._0_16_ = ZEXT416(uVar74);
      local_660 = auVar20._0_8_;
      uStack_658 = auVar20._8_8_;
      local_670 = auVar6._0_8_;
      uStack_668 = auVar6._8_8_;
      local_680._0_4_ = auVar93._0_4_;
      fVar143 = (float)local_680;
      local_680._4_4_ = auVar93._4_4_;
      fVar158 = local_680._4_4_;
      uStack_678._0_4_ = auVar93._8_4_;
      fVar159 = (float)uStack_678;
      uStack_678._4_4_ = auVar93._12_4_;
      fVar160 = uStack_678._4_4_;
      local_680 = auVar93._0_8_;
      uStack_678 = auVar93._8_8_;
      if (bVar81 != 0) {
        auVar108 = vmulps_avx512vl(local_280,auVar108);
        auVar109 = vfmadd213ps_avx512vl(auVar109,local_260,auVar108);
        auVar101 = vfmadd213ps_avx512vl(auVar101,local_240,auVar109);
        auVar101 = vfmadd213ps_avx512vl(auVar102,auVar106,auVar101);
        auVar99 = vmulps_avx512vl(local_280,auVar99);
        auVar98 = vfmadd213ps_avx512vl(auVar98,local_260,auVar99);
        auVar109 = vfmadd213ps_avx512vl(auVar97,local_240,auVar98);
        auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1210);
        auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1694);
        auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1b18);
        auVar102 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1f9c);
        auVar109 = vfmadd213ps_avx512vl(auVar100,auVar106,auVar109);
        auVar208._0_4_ = fVar168 * auVar102._0_4_;
        auVar208._4_4_ = fVar168 * auVar102._4_4_;
        auVar208._8_4_ = fVar168 * auVar102._8_4_;
        auVar208._12_4_ = fVar168 * auVar102._12_4_;
        auVar208._16_4_ = fVar168 * auVar102._16_4_;
        auVar208._20_4_ = fVar168 * auVar102._20_4_;
        auVar208._24_4_ = fVar168 * auVar102._24_4_;
        auVar208._28_4_ = 0;
        auVar100 = vmulps_avx512vl(_local_4e0,auVar102);
        auVar102 = vmulps_avx512vl(local_280,auVar102);
        auVar108 = vfmadd231ps_avx512vl(auVar208,auVar99,local_480);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar99,local_4a0);
        auVar99 = vfmadd231ps_avx512vl(auVar102,local_260,auVar99);
        auVar102 = vfmadd231ps_avx512vl(auVar108,auVar98,local_440);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,local_460);
        auVar108 = vfmadd231ps_avx512vl(auVar99,local_240,auVar98);
        auVar93 = vfmadd231ps_fma(auVar102,auVar97,local_400);
        auVar102 = vfmadd231ps_avx512vl(auVar100,auVar97,local_420);
        auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1210);
        auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1b18);
        auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1f9c);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar97);
        auVar32._4_4_ = fVar168 * auVar99._4_4_;
        auVar32._0_4_ = fVar168 * auVar99._0_4_;
        auVar32._8_4_ = fVar168 * auVar99._8_4_;
        auVar32._12_4_ = fVar168 * auVar99._12_4_;
        auVar32._16_4_ = fVar168 * auVar99._16_4_;
        auVar32._20_4_ = fVar168 * auVar99._20_4_;
        auVar32._24_4_ = fVar168 * auVar99._24_4_;
        auVar32._28_4_ = auVar97._28_4_;
        auVar97 = vmulps_avx512vl(_local_4e0,auVar99);
        auVar99 = vmulps_avx512vl(local_280,auVar99);
        auVar225 = ZEXT1664(auVar207);
        auVar95 = vfmadd231ps_avx512vl(auVar32,auVar98,local_480);
        auVar107 = vfmadd231ps_avx512vl(auVar97,auVar98,local_4a0);
        auVar98 = vfmadd231ps_avx512vl(auVar99,local_260,auVar98);
        auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1694);
        auVar99 = vfmadd231ps_avx512vl(auVar95,auVar97,local_440);
        auVar95 = vfmadd231ps_avx512vl(auVar107,auVar97,local_460);
        auVar97 = vfmadd231ps_avx512vl(auVar98,local_240,auVar97);
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar223 = ZEXT3264(auVar107);
        auVar88 = vfmadd231ps_fma(auVar99,auVar100,local_400);
        auVar98 = vfmadd231ps_avx512vl(auVar95,auVar100,local_420);
        auVar99 = vfmadd231ps_avx512vl(auVar97,auVar106,auVar100);
        auVar217._8_4_ = 0x7fffffff;
        auVar217._0_8_ = 0x7fffffff7fffffff;
        auVar217._12_4_ = 0x7fffffff;
        auVar217._16_4_ = 0x7fffffff;
        auVar217._20_4_ = 0x7fffffff;
        auVar217._24_4_ = 0x7fffffff;
        auVar217._28_4_ = 0x7fffffff;
        auVar100 = vandps_avx(ZEXT1632(auVar93),auVar217);
        auVar97 = vandps_avx(auVar102,auVar217);
        auVar97 = vmaxps_avx(auVar100,auVar97);
        auVar100 = vandps_avx(auVar108,auVar217);
        auVar100 = vmaxps_avx(auVar97,auVar100);
        auVar211._4_4_ = fVar169;
        auVar211._0_4_ = fVar169;
        auVar211._8_4_ = fVar169;
        auVar211._12_4_ = fVar169;
        auVar211._16_4_ = fVar169;
        auVar211._20_4_ = fVar169;
        auVar211._24_4_ = fVar169;
        auVar211._28_4_ = fVar169;
        uVar73 = vcmpps_avx512vl(auVar100,auVar211,1);
        bVar13 = (bool)((byte)uVar73 & 1);
        auVar110._0_4_ = (float)((uint)bVar13 * auVar96._0_4_ | (uint)!bVar13 * auVar93._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar93._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar93._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar93._12_4_);
        fVar162 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar96._16_4_);
        auVar110._16_4_ = fVar162;
        fVar161 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar96._20_4_);
        auVar110._20_4_ = fVar161;
        fVar168 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar96._24_4_);
        auVar110._24_4_ = fVar168;
        uVar75 = (uint)(byte)(uVar73 >> 7) * auVar96._28_4_;
        auVar110._28_4_ = uVar75;
        bVar13 = (bool)((byte)uVar73 & 1);
        auVar111._0_4_ = (float)((uint)bVar13 * auVar105._0_4_ | (uint)!bVar13 * auVar102._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar13 * auVar105._4_4_ | (uint)!bVar13 * auVar102._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar13 * auVar105._8_4_ | (uint)!bVar13 * auVar102._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar13 * auVar105._12_4_ | (uint)!bVar13 * auVar102._12_4_);
        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar13 * auVar105._16_4_ | (uint)!bVar13 * auVar102._16_4_);
        bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar13 * auVar105._20_4_ | (uint)!bVar13 * auVar102._20_4_);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar13 * auVar105._24_4_ | (uint)!bVar13 * auVar102._24_4_);
        bVar13 = SUB81(uVar73 >> 7,0);
        auVar111._28_4_ = (uint)bVar13 * auVar105._28_4_ | (uint)!bVar13 * auVar102._28_4_;
        auVar100 = vandps_avx(auVar217,ZEXT1632(auVar88));
        auVar97 = vandps_avx(auVar98,auVar217);
        auVar97 = vmaxps_avx(auVar100,auVar97);
        auVar100 = vandps_avx(auVar99,auVar217);
        auVar100 = vmaxps_avx(auVar97,auVar100);
        uVar73 = vcmpps_avx512vl(auVar100,auVar211,1);
        bVar13 = (bool)((byte)uVar73 & 1);
        auVar112._0_4_ = (float)((uint)bVar13 * auVar96._0_4_ | (uint)!bVar13 * auVar88._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar88._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar88._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar88._12_4_);
        fVar183 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar96._16_4_);
        auVar112._16_4_ = fVar183;
        fVar179 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar96._20_4_);
        auVar112._20_4_ = fVar179;
        fVar178 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar96._24_4_);
        auVar112._24_4_ = fVar178;
        auVar112._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar96._28_4_;
        bVar13 = (bool)((byte)uVar73 & 1);
        auVar113._0_4_ = (float)((uint)bVar13 * auVar105._0_4_ | (uint)!bVar13 * auVar98._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar13 * auVar105._4_4_ | (uint)!bVar13 * auVar98._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar13 * auVar105._8_4_ | (uint)!bVar13 * auVar98._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar13 * auVar105._12_4_ | (uint)!bVar13 * auVar98._12_4_);
        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar13 * auVar105._16_4_ | (uint)!bVar13 * auVar98._16_4_);
        bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar13 * auVar105._20_4_ | (uint)!bVar13 * auVar98._20_4_);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar13 * auVar105._24_4_ | (uint)!bVar13 * auVar98._24_4_);
        bVar13 = SUB81(uVar73 >> 7,0);
        auVar113._28_4_ = (uint)bVar13 * auVar105._28_4_ | (uint)!bVar13 * auVar98._28_4_;
        auVar91 = vxorps_avx512vl(local_440._0_16_,local_440._0_16_);
        auVar100 = vfmadd213ps_avx512vl(auVar110,auVar110,ZEXT1632(auVar91));
        auVar93 = vfmadd231ps_fma(auVar100,auVar111,auVar111);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
        fVar83 = auVar100._0_4_;
        fVar84 = auVar100._4_4_;
        fVar135 = auVar100._8_4_;
        fVar136 = auVar100._12_4_;
        fVar137 = auVar100._16_4_;
        fVar138 = auVar100._20_4_;
        fVar139 = auVar100._24_4_;
        auVar33._4_4_ = fVar84 * fVar84 * fVar84 * auVar93._4_4_ * -0.5;
        auVar33._0_4_ = fVar83 * fVar83 * fVar83 * auVar93._0_4_ * -0.5;
        auVar33._8_4_ = fVar135 * fVar135 * fVar135 * auVar93._8_4_ * -0.5;
        auVar33._12_4_ = fVar136 * fVar136 * fVar136 * auVar93._12_4_ * -0.5;
        auVar33._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
        auVar33._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar33._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar33._28_4_ = 0;
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar98 = vfmadd231ps_avx512vl(auVar33,auVar97,auVar100);
        auVar34._4_4_ = auVar111._4_4_ * auVar98._4_4_;
        auVar34._0_4_ = auVar111._0_4_ * auVar98._0_4_;
        auVar34._8_4_ = auVar111._8_4_ * auVar98._8_4_;
        auVar34._12_4_ = auVar111._12_4_ * auVar98._12_4_;
        auVar34._16_4_ = auVar111._16_4_ * auVar98._16_4_;
        auVar34._20_4_ = auVar111._20_4_ * auVar98._20_4_;
        auVar34._24_4_ = auVar111._24_4_ * auVar98._24_4_;
        auVar34._28_4_ = auVar100._28_4_;
        auVar35._4_4_ = auVar98._4_4_ * -auVar110._4_4_;
        auVar35._0_4_ = auVar98._0_4_ * -auVar110._0_4_;
        auVar35._8_4_ = auVar98._8_4_ * -auVar110._8_4_;
        auVar35._12_4_ = auVar98._12_4_ * -auVar110._12_4_;
        auVar35._16_4_ = auVar98._16_4_ * -fVar162;
        auVar35._20_4_ = auVar98._20_4_ * -fVar161;
        auVar35._24_4_ = auVar98._24_4_ * -fVar168;
        auVar35._28_4_ = uVar75 ^ 0x80000000;
        auVar100 = vmulps_avx512vl(auVar98,ZEXT1632(auVar91));
        auVar96 = ZEXT1632(auVar91);
        auVar99 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar96);
        auVar93 = vfmadd231ps_fma(auVar99,auVar113,auVar113);
        auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
        fVar168 = auVar99._0_4_;
        fVar161 = auVar99._4_4_;
        fVar162 = auVar99._8_4_;
        fVar83 = auVar99._12_4_;
        fVar84 = auVar99._16_4_;
        fVar135 = auVar99._20_4_;
        fVar136 = auVar99._24_4_;
        auVar36._4_4_ = fVar161 * fVar161 * fVar161 * auVar93._4_4_ * -0.5;
        auVar36._0_4_ = fVar168 * fVar168 * fVar168 * auVar93._0_4_ * -0.5;
        auVar36._8_4_ = fVar162 * fVar162 * fVar162 * auVar93._8_4_ * -0.5;
        auVar36._12_4_ = fVar83 * fVar83 * fVar83 * auVar93._12_4_ * -0.5;
        auVar36._16_4_ = fVar84 * fVar84 * fVar84 * -0.0;
        auVar36._20_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar36._24_4_ = fVar136 * fVar136 * fVar136 * -0.0;
        auVar36._28_4_ = 0;
        auVar97 = vfmadd231ps_avx512vl(auVar36,auVar97,auVar99);
        auVar37._4_4_ = auVar113._4_4_ * auVar97._4_4_;
        auVar37._0_4_ = auVar113._0_4_ * auVar97._0_4_;
        auVar37._8_4_ = auVar113._8_4_ * auVar97._8_4_;
        auVar37._12_4_ = auVar113._12_4_ * auVar97._12_4_;
        auVar37._16_4_ = auVar113._16_4_ * auVar97._16_4_;
        auVar37._20_4_ = auVar113._20_4_ * auVar97._20_4_;
        auVar37._24_4_ = auVar113._24_4_ * auVar97._24_4_;
        auVar37._28_4_ = auVar99._28_4_;
        auVar38._4_4_ = -auVar112._4_4_ * auVar97._4_4_;
        auVar38._0_4_ = -auVar112._0_4_ * auVar97._0_4_;
        auVar38._8_4_ = -auVar112._8_4_ * auVar97._8_4_;
        auVar38._12_4_ = -auVar112._12_4_ * auVar97._12_4_;
        auVar38._16_4_ = -fVar183 * auVar97._16_4_;
        auVar38._20_4_ = -fVar179 * auVar97._20_4_;
        auVar38._24_4_ = -fVar178 * auVar97._24_4_;
        auVar38._28_4_ = auVar98._28_4_;
        auVar97 = vmulps_avx512vl(auVar97,auVar96);
        auVar93 = vfmadd213ps_fma(auVar34,auVar94,auVar103);
        auVar88 = vfmadd213ps_fma(auVar35,auVar94,auVar104);
        auVar98 = vfmadd213ps_avx512vl(auVar100,auVar94,auVar109);
        auVar99 = vfmadd213ps_avx512vl(auVar37,ZEXT1632(auVar181),ZEXT1632(auVar171));
        auVar170 = vfnmadd213ps_fma(auVar34,auVar94,auVar103);
        auVar108 = ZEXT1632(auVar181);
        auVar89 = vfmadd213ps_fma(auVar38,auVar108,ZEXT1632(auVar180));
        auVar90 = vfnmadd213ps_fma(auVar35,auVar94,auVar104);
        auVar87 = vfmadd213ps_fma(auVar97,auVar108,auVar101);
        auVar102 = vfnmadd231ps_avx512vl(auVar109,auVar94,auVar100);
        auVar171 = vfnmadd213ps_fma(auVar37,auVar108,ZEXT1632(auVar171));
        auVar180 = vfnmadd213ps_fma(auVar38,auVar108,ZEXT1632(auVar180));
        auVar207 = vfnmadd231ps_fma(auVar101,ZEXT1632(auVar181),auVar97);
        auVar97 = vsubps_avx512vl(auVar99,ZEXT1632(auVar170));
        auVar100 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar90));
        auVar101 = vsubps_avx512vl(ZEXT1632(auVar87),auVar102);
        auVar109 = vmulps_avx512vl(auVar100,auVar102);
        auVar86 = vfmsub231ps_fma(auVar109,ZEXT1632(auVar90),auVar101);
        auVar39._4_4_ = auVar170._4_4_ * auVar101._4_4_;
        auVar39._0_4_ = auVar170._0_4_ * auVar101._0_4_;
        auVar39._8_4_ = auVar170._8_4_ * auVar101._8_4_;
        auVar39._12_4_ = auVar170._12_4_ * auVar101._12_4_;
        auVar39._16_4_ = auVar101._16_4_ * 0.0;
        auVar39._20_4_ = auVar101._20_4_ * 0.0;
        auVar39._24_4_ = auVar101._24_4_ * 0.0;
        auVar39._28_4_ = auVar101._28_4_;
        auVar101 = vfmsub231ps_avx512vl(auVar39,auVar102,auVar97);
        auVar40._4_4_ = auVar90._4_4_ * auVar97._4_4_;
        auVar40._0_4_ = auVar90._0_4_ * auVar97._0_4_;
        auVar40._8_4_ = auVar90._8_4_ * auVar97._8_4_;
        auVar40._12_4_ = auVar90._12_4_ * auVar97._12_4_;
        auVar40._16_4_ = auVar97._16_4_ * 0.0;
        auVar40._20_4_ = auVar97._20_4_ * 0.0;
        auVar40._24_4_ = auVar97._24_4_ * 0.0;
        auVar40._28_4_ = auVar97._28_4_;
        auVar7 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar170),auVar100);
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar96,auVar101);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,ZEXT1632(auVar86));
        auVar105 = ZEXT1632(auVar91);
        uVar73 = vcmpps_avx512vl(auVar100,auVar105,2);
        bVar72 = (byte)uVar73;
        fVar83 = (float)((uint)(bVar72 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar171._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar135 = (float)((uint)bVar13 * auVar93._4_4_ | (uint)!bVar13 * auVar171._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar137 = (float)((uint)bVar13 * auVar93._8_4_ | (uint)!bVar13 * auVar171._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar139 = (float)((uint)bVar13 * auVar93._12_4_ | (uint)!bVar13 * auVar171._12_4_);
        auVar109 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar137,CONCAT44(fVar135,fVar83))));
        fVar84 = (float)((uint)(bVar72 & 1) * auVar88._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar180._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar136 = (float)((uint)bVar13 * auVar88._4_4_ | (uint)!bVar13 * auVar180._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar138 = (float)((uint)bVar13 * auVar88._8_4_ | (uint)!bVar13 * auVar180._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar140 = (float)((uint)bVar13 * auVar88._12_4_ | (uint)!bVar13 * auVar180._12_4_);
        auVar108 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar138,CONCAT44(fVar136,fVar84))));
        auVar114._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar207._0_4_
                    );
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar207._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar207._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar207._12_4_);
        fVar162 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar98._16_4_);
        auVar114._16_4_ = fVar162;
        fVar168 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar98._20_4_);
        auVar114._20_4_ = fVar168;
        fVar161 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar98._24_4_);
        auVar114._24_4_ = fVar161;
        iVar1 = (uint)(byte)(uVar73 >> 7) * auVar98._28_4_;
        auVar114._28_4_ = iVar1;
        auVar97 = vblendmps_avx512vl(ZEXT1632(auVar170),auVar99);
        auVar115._0_4_ =
             (uint)(bVar72 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar86._0_4_;
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar86._4_4_;
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar86._8_4_;
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar86._12_4_;
        auVar115._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar97._16_4_;
        auVar115._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar97._20_4_;
        auVar115._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar97._24_4_;
        auVar115._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar97._28_4_;
        auVar97 = vblendmps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar89));
        auVar116._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar88._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar88._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar88._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar88._12_4_);
        fVar179 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar97._16_4_);
        auVar116._16_4_ = fVar179;
        fVar183 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar97._20_4_);
        auVar116._20_4_ = fVar183;
        fVar178 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar97._24_4_);
        auVar116._24_4_ = fVar178;
        auVar116._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar97._28_4_;
        auVar97 = vblendmps_avx512vl(auVar102,ZEXT1632(auVar87));
        auVar117._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar98._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar98._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar98._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar98._12_4_);
        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar13 * auVar97._16_4_ | (uint)!bVar13 * auVar98._16_4_);
        bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar13 * auVar97._20_4_ | (uint)!bVar13 * auVar98._20_4_);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar13 * auVar97._24_4_ | (uint)!bVar13 * auVar98._24_4_);
        bVar13 = SUB81(uVar73 >> 7,0);
        auVar117._28_4_ = (uint)bVar13 * auVar97._28_4_ | (uint)!bVar13 * auVar98._28_4_;
        auVar118._0_4_ =
             (uint)(bVar72 & 1) * (int)auVar170._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar99._0_4_;
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar13 * (int)auVar170._4_4_ | (uint)!bVar13 * auVar99._4_4_;
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar13 * (int)auVar170._8_4_ | (uint)!bVar13 * auVar99._8_4_;
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar13 * (int)auVar170._12_4_ | (uint)!bVar13 * auVar99._12_4_;
        auVar118._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar99._16_4_;
        auVar118._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar99._20_4_;
        auVar118._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar99._24_4_;
        auVar118._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar99._28_4_;
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar119._0_4_ =
             (uint)(bVar72 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar87._0_4_;
        bVar14 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar14 * auVar102._4_4_ | (uint)!bVar14 * auVar87._4_4_;
        bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar14 * auVar102._8_4_ | (uint)!bVar14 * auVar87._8_4_;
        bVar14 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar14 * auVar102._12_4_ | (uint)!bVar14 * auVar87._12_4_;
        auVar119._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar102._16_4_;
        auVar119._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar102._20_4_;
        auVar119._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar102._24_4_;
        iVar2 = (uint)(byte)(uVar73 >> 7) * auVar102._28_4_;
        auVar119._28_4_ = iVar2;
        auVar103 = vsubps_avx512vl(auVar118,auVar109);
        auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar90._12_4_ |
                                                (uint)!bVar16 * auVar89._12_4_,
                                                CONCAT48((uint)bVar15 * (int)auVar90._8_4_ |
                                                         (uint)!bVar15 * auVar89._8_4_,
                                                         CONCAT44((uint)bVar13 * (int)auVar90._4_4_
                                                                  | (uint)!bVar13 * auVar89._4_4_,
                                                                  (uint)(bVar72 & 1) *
                                                                  (int)auVar90._0_4_ |
                                                                  (uint)!(bool)(bVar72 & 1) *
                                                                  auVar89._0_4_)))),auVar108);
        auVar203 = ZEXT3264(auVar97);
        auVar98 = vsubps_avx(auVar119,auVar114);
        auVar99 = vsubps_avx(auVar109,auVar115);
        auVar206 = ZEXT3264(auVar99);
        auVar102 = vsubps_avx(auVar108,auVar116);
        auVar101 = vsubps_avx(auVar114,auVar117);
        auVar41._4_4_ = auVar98._4_4_ * fVar135;
        auVar41._0_4_ = auVar98._0_4_ * fVar83;
        auVar41._8_4_ = auVar98._8_4_ * fVar137;
        auVar41._12_4_ = auVar98._12_4_ * fVar139;
        auVar41._16_4_ = auVar98._16_4_ * 0.0;
        auVar41._20_4_ = auVar98._20_4_ * 0.0;
        auVar41._24_4_ = auVar98._24_4_ * 0.0;
        auVar41._28_4_ = iVar2;
        auVar93 = vfmsub231ps_fma(auVar41,auVar114,auVar103);
        auVar42._4_4_ = fVar136 * auVar103._4_4_;
        auVar42._0_4_ = fVar84 * auVar103._0_4_;
        auVar42._8_4_ = fVar138 * auVar103._8_4_;
        auVar42._12_4_ = fVar140 * auVar103._12_4_;
        auVar42._16_4_ = auVar103._16_4_ * 0.0;
        auVar42._20_4_ = auVar103._20_4_ * 0.0;
        auVar42._24_4_ = auVar103._24_4_ * 0.0;
        auVar42._28_4_ = auVar100._28_4_;
        auVar88 = vfmsub231ps_fma(auVar42,auVar109,auVar97);
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar105,ZEXT1632(auVar93));
        auVar190._0_4_ = auVar97._0_4_ * auVar114._0_4_;
        auVar190._4_4_ = auVar97._4_4_ * auVar114._4_4_;
        auVar190._8_4_ = auVar97._8_4_ * auVar114._8_4_;
        auVar190._12_4_ = auVar97._12_4_ * auVar114._12_4_;
        auVar190._16_4_ = auVar97._16_4_ * fVar162;
        auVar190._20_4_ = auVar97._20_4_ * fVar168;
        auVar190._24_4_ = auVar97._24_4_ * fVar161;
        auVar190._28_4_ = 0;
        auVar93 = vfmsub231ps_fma(auVar190,auVar108,auVar98);
        auVar104 = vfmadd231ps_avx512vl(auVar100,auVar105,ZEXT1632(auVar93));
        auVar100 = vmulps_avx512vl(auVar101,auVar115);
        auVar100 = vfmsub231ps_avx512vl(auVar100,auVar99,auVar117);
        auVar43._4_4_ = auVar102._4_4_ * auVar117._4_4_;
        auVar43._0_4_ = auVar102._0_4_ * auVar117._0_4_;
        auVar43._8_4_ = auVar102._8_4_ * auVar117._8_4_;
        auVar43._12_4_ = auVar102._12_4_ * auVar117._12_4_;
        auVar43._16_4_ = auVar102._16_4_ * auVar117._16_4_;
        auVar43._20_4_ = auVar102._20_4_ * auVar117._20_4_;
        auVar43._24_4_ = auVar102._24_4_ * auVar117._24_4_;
        auVar43._28_4_ = auVar117._28_4_;
        auVar93 = vfmsub231ps_fma(auVar43,auVar116,auVar101);
        auVar191._0_4_ = auVar116._0_4_ * auVar99._0_4_;
        auVar191._4_4_ = auVar116._4_4_ * auVar99._4_4_;
        auVar191._8_4_ = auVar116._8_4_ * auVar99._8_4_;
        auVar191._12_4_ = auVar116._12_4_ * auVar99._12_4_;
        auVar191._16_4_ = fVar179 * auVar99._16_4_;
        auVar191._20_4_ = fVar183 * auVar99._20_4_;
        auVar191._24_4_ = fVar178 * auVar99._24_4_;
        auVar191._28_4_ = 0;
        auVar88 = vfmsub231ps_fma(auVar191,auVar102,auVar115);
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar105,auVar100);
        auVar96 = vfmadd231ps_avx512vl(auVar100,auVar105,ZEXT1632(auVar93));
        auVar196 = ZEXT3264(auVar96);
        auVar100 = vmaxps_avx(auVar104,auVar96);
        uVar163 = vcmpps_avx512vl(auVar100,auVar105,2);
        bVar81 = bVar81 & (byte)uVar163;
        if (bVar81 != 0) {
          uVar144 = *(undefined4 *)(ray + sVar80 * 4 + 0x100);
          auVar218._4_4_ = uVar144;
          auVar218._0_4_ = uVar144;
          auVar218._8_4_ = uVar144;
          auVar218._12_4_ = uVar144;
          auVar218._16_4_ = uVar144;
          auVar218._20_4_ = uVar144;
          auVar218._24_4_ = uVar144;
          auVar218._28_4_ = uVar144;
          auVar221 = ZEXT3264(auVar218);
          auVar44._4_4_ = auVar101._4_4_ * auVar97._4_4_;
          auVar44._0_4_ = auVar101._0_4_ * auVar97._0_4_;
          auVar44._8_4_ = auVar101._8_4_ * auVar97._8_4_;
          auVar44._12_4_ = auVar101._12_4_ * auVar97._12_4_;
          auVar44._16_4_ = auVar101._16_4_ * auVar97._16_4_;
          auVar44._20_4_ = auVar101._20_4_ * auVar97._20_4_;
          auVar44._24_4_ = auVar101._24_4_ * auVar97._24_4_;
          auVar44._28_4_ = auVar100._28_4_;
          auVar87 = vfmsub231ps_fma(auVar44,auVar102,auVar98);
          auVar45._4_4_ = auVar98._4_4_ * auVar99._4_4_;
          auVar45._0_4_ = auVar98._0_4_ * auVar99._0_4_;
          auVar45._8_4_ = auVar98._8_4_ * auVar99._8_4_;
          auVar45._12_4_ = auVar98._12_4_ * auVar99._12_4_;
          auVar45._16_4_ = auVar98._16_4_ * auVar99._16_4_;
          auVar45._20_4_ = auVar98._20_4_ * auVar99._20_4_;
          auVar45._24_4_ = auVar98._24_4_ * auVar99._24_4_;
          auVar45._28_4_ = auVar98._28_4_;
          auVar89 = vfmsub231ps_fma(auVar45,auVar103,auVar101);
          auVar46._4_4_ = auVar102._4_4_ * auVar103._4_4_;
          auVar46._0_4_ = auVar102._0_4_ * auVar103._0_4_;
          auVar46._8_4_ = auVar102._8_4_ * auVar103._8_4_;
          auVar46._12_4_ = auVar102._12_4_ * auVar103._12_4_;
          auVar46._16_4_ = auVar102._16_4_ * auVar103._16_4_;
          auVar46._20_4_ = auVar102._20_4_ * auVar103._20_4_;
          auVar46._24_4_ = auVar102._24_4_ * auVar103._24_4_;
          auVar46._28_4_ = auVar102._28_4_;
          auVar86 = vfmsub231ps_fma(auVar46,auVar99,auVar97);
          auVar93 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar86));
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar93),ZEXT1632(auVar87),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar100 = vrcp14ps_avx512vl(ZEXT1632(auVar88));
          auVar206 = ZEXT3264(auVar100);
          auVar97 = vfnmadd213ps_avx512vl(auVar100,ZEXT1632(auVar88),auVar107);
          auVar93 = vfmadd132ps_fma(auVar97,auVar100,auVar100);
          auVar203 = ZEXT1664(auVar93);
          auVar47._4_4_ = auVar86._4_4_ * auVar114._4_4_;
          auVar47._0_4_ = auVar86._0_4_ * auVar114._0_4_;
          auVar47._8_4_ = auVar86._8_4_ * auVar114._8_4_;
          auVar47._12_4_ = auVar86._12_4_ * auVar114._12_4_;
          auVar47._16_4_ = fVar162 * 0.0;
          auVar47._20_4_ = fVar168 * 0.0;
          auVar47._24_4_ = fVar161 * 0.0;
          auVar47._28_4_ = iVar1;
          auVar89 = vfmadd231ps_fma(auVar47,auVar108,ZEXT1632(auVar89));
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar109,ZEXT1632(auVar87));
          fVar168 = auVar93._0_4_;
          fVar161 = auVar93._4_4_;
          fVar162 = auVar93._8_4_;
          fVar178 = auVar93._12_4_;
          local_580 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar178,
                                         CONCAT48(auVar89._8_4_ * fVar162,
                                                  CONCAT44(auVar89._4_4_ * fVar161,
                                                           auVar89._0_4_ * fVar168))));
          auVar210 = ZEXT3264(local_580);
          auVar151._4_4_ = uVar74;
          auVar151._0_4_ = uVar74;
          auVar151._8_4_ = uVar74;
          auVar151._12_4_ = uVar74;
          auVar151._16_4_ = uVar74;
          auVar151._20_4_ = uVar74;
          auVar151._24_4_ = uVar74;
          auVar151._28_4_ = uVar74;
          uVar163 = vcmpps_avx512vl(local_580,auVar218,2);
          uVar21 = vcmpps_avx512vl(auVar151,local_580,2);
          bVar81 = (byte)uVar163 & (byte)uVar21 & bVar81;
          if (bVar81 != 0) {
            uVar82 = vcmpps_avx512vl(ZEXT1632(auVar88),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar82 = bVar81 & uVar82;
            if ((char)uVar82 != '\0') {
              fVar179 = auVar104._0_4_ * fVar168;
              fVar183 = auVar104._4_4_ * fVar161;
              auVar48._4_4_ = fVar183;
              auVar48._0_4_ = fVar179;
              fVar83 = auVar104._8_4_ * fVar162;
              auVar48._8_4_ = fVar83;
              fVar84 = auVar104._12_4_ * fVar178;
              auVar48._12_4_ = fVar84;
              fVar135 = auVar104._16_4_ * 0.0;
              auVar48._16_4_ = fVar135;
              fVar136 = auVar104._20_4_ * 0.0;
              auVar48._20_4_ = fVar136;
              fVar137 = auVar104._24_4_ * 0.0;
              auVar48._24_4_ = fVar137;
              auVar48._28_4_ = auVar104._28_4_;
              auVar100 = vsubps_avx512vl(auVar107,auVar48);
              local_3e0._0_4_ =
                   (float)((uint)(bVar72 & 1) * (int)fVar179 |
                          (uint)!(bool)(bVar72 & 1) * auVar100._0_4_);
              bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
              local_3e0._4_4_ =
                   (float)((uint)bVar13 * (int)fVar183 | (uint)!bVar13 * auVar100._4_4_);
              bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
              local_3e0._8_4_ = (float)((uint)bVar13 * (int)fVar83 | (uint)!bVar13 * auVar100._8_4_)
              ;
              bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
              local_3e0._12_4_ =
                   (float)((uint)bVar13 * (int)fVar84 | (uint)!bVar13 * auVar100._12_4_);
              bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
              local_3e0._16_4_ =
                   (float)((uint)bVar13 * (int)fVar135 | (uint)!bVar13 * auVar100._16_4_);
              bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
              local_3e0._20_4_ =
                   (float)((uint)bVar13 * (int)fVar136 | (uint)!bVar13 * auVar100._20_4_);
              bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
              local_3e0._24_4_ =
                   (float)((uint)bVar13 * (int)fVar137 | (uint)!bVar13 * auVar100._24_4_);
              bVar13 = SUB81(uVar73 >> 7,0);
              local_3e0._28_4_ =
                   (float)((uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar100._28_4_);
              auVar100 = vsubps_avx(ZEXT1632(auVar181),auVar94);
              auVar93 = vfmadd213ps_fma(auVar100,local_3e0,auVar94);
              uVar144 = *(undefined4 *)((long)pre->ray_space + sVar80 * 4 + -0x20);
              auVar27._4_4_ = uVar144;
              auVar27._0_4_ = uVar144;
              auVar27._8_4_ = uVar144;
              auVar27._12_4_ = uVar144;
              auVar27._16_4_ = uVar144;
              auVar27._20_4_ = uVar144;
              auVar27._24_4_ = uVar144;
              auVar27._28_4_ = uVar144;
              auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar93._12_4_ + auVar93._12_4_,
                                                            CONCAT48(auVar93._8_4_ + auVar93._8_4_,
                                                                     CONCAT44(auVar93._4_4_ +
                                                                              auVar93._4_4_,
                                                                              auVar93._0_4_ +
                                                                              auVar93._0_4_)))),
                                         auVar27);
              uVar76 = vcmpps_avx512vl(local_580,auVar100,6);
              uVar82 = uVar82 & uVar76;
              bVar81 = (byte)uVar82;
              if (bVar81 != 0) {
                auVar177._0_4_ = auVar96._0_4_ * fVar168;
                auVar177._4_4_ = auVar96._4_4_ * fVar161;
                auVar177._8_4_ = auVar96._8_4_ * fVar162;
                auVar177._12_4_ = auVar96._12_4_ * fVar178;
                auVar177._16_4_ = auVar96._16_4_ * 0.0;
                auVar177._20_4_ = auVar96._20_4_ * 0.0;
                auVar177._24_4_ = auVar96._24_4_ * 0.0;
                auVar177._28_4_ = 0;
                auVar100 = vsubps_avx512vl(auVar107,auVar177);
                auVar120._0_4_ =
                     (uint)(bVar72 & 1) * (int)auVar177._0_4_ |
                     (uint)!(bool)(bVar72 & 1) * auVar100._0_4_;
                bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
                auVar120._4_4_ = (uint)bVar13 * (int)auVar177._4_4_ | (uint)!bVar13 * auVar100._4_4_
                ;
                bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                auVar120._8_4_ = (uint)bVar13 * (int)auVar177._8_4_ | (uint)!bVar13 * auVar100._8_4_
                ;
                bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                auVar120._12_4_ =
                     (uint)bVar13 * (int)auVar177._12_4_ | (uint)!bVar13 * auVar100._12_4_;
                bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                auVar120._16_4_ =
                     (uint)bVar13 * (int)auVar177._16_4_ | (uint)!bVar13 * auVar100._16_4_;
                bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
                auVar120._20_4_ =
                     (uint)bVar13 * (int)auVar177._20_4_ | (uint)!bVar13 * auVar100._20_4_;
                bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
                auVar120._24_4_ =
                     (uint)bVar13 * (int)auVar177._24_4_ | (uint)!bVar13 * auVar100._24_4_;
                auVar120._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar100._28_4_;
                auVar28._8_4_ = 0x40000000;
                auVar28._0_8_ = 0x4000000040000000;
                auVar28._12_4_ = 0x40000000;
                auVar28._16_4_ = 0x40000000;
                auVar28._20_4_ = 0x40000000;
                auVar28._24_4_ = 0x40000000;
                auVar28._28_4_ = 0x40000000;
                local_3c0 = vfmsub132ps_avx512vl(auVar120,auVar107,auVar28);
                local_380 = 0;
                local_360 = local_660;
                uStack_358 = uStack_658;
                local_350 = local_670;
                uStack_348 = uStack_668;
                local_340 = local_680;
                uStack_338 = uStack_678;
                if ((pGVar11->mask & *(uint *)(ray + sVar80 * 4 + 0x120)) != 0) {
                  local_5c0._0_8_ = pGVar11;
                  fVar168 = 1.0 / auVar212._0_4_;
                  local_320[0] = fVar168 * (local_3e0._0_4_ + 0.0);
                  local_320[1] = fVar168 * (local_3e0._4_4_ + 1.0);
                  local_320[2] = fVar168 * (local_3e0._8_4_ + 2.0);
                  local_320[3] = fVar168 * (local_3e0._12_4_ + 3.0);
                  fStack_310 = fVar168 * (local_3e0._16_4_ + 4.0);
                  fStack_30c = fVar168 * (local_3e0._20_4_ + 5.0);
                  fStack_308 = fVar168 * (local_3e0._24_4_ + 6.0);
                  fStack_304 = local_3e0._28_4_ + 7.0;
                  local_300 = local_3c0;
                  local_2e0 = local_580;
                  auVar152._8_4_ = 0x7f800000;
                  auVar152._0_8_ = 0x7f8000007f800000;
                  auVar152._12_4_ = 0x7f800000;
                  auVar152._16_4_ = 0x7f800000;
                  auVar152._20_4_ = 0x7f800000;
                  auVar152._24_4_ = 0x7f800000;
                  auVar152._28_4_ = 0x7f800000;
                  auVar100 = vblendmps_avx512vl(auVar152,local_580);
                  auVar121._0_4_ =
                       (uint)(bVar81 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar82 >> 1) & 1);
                  auVar121._4_4_ = (uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar82 >> 2) & 1);
                  auVar121._8_4_ = (uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar82 >> 3) & 1);
                  auVar121._12_4_ = (uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar82 >> 4) & 1);
                  auVar121._16_4_ = (uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar82 >> 5) & 1);
                  auVar121._20_4_ = (uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar82 >> 6) & 1);
                  auVar121._24_4_ = (uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = SUB81(uVar82 >> 7,0);
                  auVar121._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar100 = vshufps_avx(auVar121,auVar121,0xb1);
                  auVar100 = vminps_avx(auVar121,auVar100);
                  auVar97 = vshufpd_avx(auVar100,auVar100,5);
                  auVar100 = vminps_avx(auVar100,auVar97);
                  auVar97 = vpermpd_avx2(auVar100,0x4e);
                  auVar100 = vminps_avx(auVar100,auVar97);
                  uVar163 = vcmpps_avx512vl(auVar121,auVar100,0);
                  uVar74 = (uint)uVar82;
                  if (((byte)uVar163 & bVar81) != 0) {
                    uVar74 = (uint)((byte)uVar163 & bVar81);
                  }
                  uVar75 = 0;
                  for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                    uVar75 = uVar75 + 1;
                  }
                  uVar73 = (ulong)uVar75;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_500 = vpbroadcastd_avx512vl();
                    local_520 = vpbroadcastd_avx512vl();
                    local_5e0 = auVar106;
                    local_3a0 = local_580;
                    local_37c = iVar9;
                    local_370 = auVar85;
                    do {
                      fVar168 = local_320[uVar73];
                      auVar165._4_4_ = fVar168;
                      auVar165._0_4_ = fVar168;
                      auVar165._8_4_ = fVar168;
                      auVar165._12_4_ = fVar168;
                      local_1c0._16_4_ = fVar168;
                      local_1c0._0_16_ = auVar165;
                      local_1c0._20_4_ = fVar168;
                      local_1c0._24_4_ = fVar168;
                      local_1c0._28_4_ = fVar168;
                      local_1a0 = *(undefined4 *)(local_300 + uVar73 * 4);
                      *(undefined4 *)(ray + sVar80 * 4 + 0x100) =
                           *(undefined4 *)(local_2e0 + uVar73 * 4);
                      local_650.context = context->user;
                      fVar161 = 1.0 - fVar168;
                      auVar26._8_4_ = 0x80000000;
                      auVar26._0_8_ = 0x8000000080000000;
                      auVar26._12_4_ = 0x80000000;
                      auVar89 = vxorps_avx512vl(ZEXT416((uint)fVar161),auVar26);
                      auVar93 = ZEXT416((uint)(fVar168 * fVar161 * 4.0));
                      auVar88 = vfnmsub213ss_fma(auVar165,auVar165,auVar93);
                      auVar93 = vfmadd213ss_fma(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),
                                                auVar93);
                      auVar206 = ZEXT464(0x3f000000);
                      fVar161 = fVar161 * auVar89._0_4_ * 0.5;
                      fVar162 = auVar88._0_4_ * 0.5;
                      fVar178 = auVar93._0_4_ * 0.5;
                      fVar168 = fVar168 * fVar168 * 0.5;
                      auVar199._0_4_ = fVar168 * fVar143;
                      auVar199._4_4_ = fVar168 * fVar158;
                      auVar199._8_4_ = fVar168 * fVar159;
                      auVar199._12_4_ = fVar168 * fVar160;
                      auVar147._4_4_ = fVar178;
                      auVar147._0_4_ = fVar178;
                      auVar147._8_4_ = fVar178;
                      auVar147._12_4_ = fVar178;
                      auVar93 = vfmadd132ps_fma(auVar147,auVar199,auVar6);
                      auVar189._4_4_ = fVar162;
                      auVar189._0_4_ = fVar162;
                      auVar189._8_4_ = fVar162;
                      auVar189._12_4_ = fVar162;
                      auVar93 = vfmadd132ps_fma(auVar189,auVar93,auVar20);
                      auVar148._4_4_ = fVar161;
                      auVar148._0_4_ = fVar161;
                      auVar148._8_4_ = fVar161;
                      auVar148._12_4_ = fVar161;
                      auVar93 = vfmadd213ps_fma(auVar148,auVar85,auVar93);
                      local_220 = auVar93._0_4_;
                      auVar195._8_4_ = 1;
                      auVar195._0_8_ = 0x100000001;
                      auVar195._12_4_ = 1;
                      auVar195._16_4_ = 1;
                      auVar195._20_4_ = 1;
                      auVar195._24_4_ = 1;
                      auVar195._28_4_ = 1;
                      local_200 = vpermps_avx2(auVar195,ZEXT1632(auVar93));
                      auVar196 = ZEXT3264(local_200);
                      auVar200._8_4_ = 2;
                      auVar200._0_8_ = 0x200000002;
                      auVar200._12_4_ = 2;
                      auVar202._16_4_ = 2;
                      auVar202._0_16_ = auVar200;
                      auVar202._20_4_ = 2;
                      auVar202._24_4_ = 2;
                      auVar202._28_4_ = 2;
                      auVar203 = ZEXT3264(auVar202);
                      local_1e0 = vpermps_avx2(auVar202,ZEXT1632(auVar93));
                      iStack_21c = local_220;
                      iStack_218 = local_220;
                      iStack_214 = local_220;
                      iStack_210 = local_220;
                      iStack_20c = local_220;
                      iStack_208 = local_220;
                      iStack_204 = local_220;
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = local_520._0_8_;
                      uStack_178 = local_520._8_8_;
                      uStack_170 = local_520._16_8_;
                      uStack_168 = local_520._24_8_;
                      local_160 = local_500;
                      auVar100 = vpcmpeqd_avx2(local_500,local_500);
                      local_608[1] = auVar100;
                      *local_608 = auVar100;
                      local_140 = (local_650.context)->instID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_120 = (local_650.context)->instPrimID[0];
                      uStack_11c = local_120;
                      uStack_118 = local_120;
                      uStack_114 = local_120;
                      uStack_110 = local_120;
                      uStack_10c = local_120;
                      uStack_108 = local_120;
                      uStack_104 = local_120;
                      local_600 = local_2a0;
                      local_650.valid = (int *)local_600;
                      local_650.geometryUserPtr = *(void **)(local_5c0._0_8_ + 0x18);
                      local_650.hit = (RTCHitN *)&local_220;
                      local_650.N = 8;
                      _local_560 = auVar221._0_32_;
                      local_650.ray = (RTCRayN *)ray;
                      if (*(code **)(local_5c0._0_8_ + 0x40) != (code *)0x0) {
                        auVar196 = ZEXT1664(local_200._0_16_);
                        auVar203 = ZEXT1664(auVar200);
                        auVar206 = ZEXT1664(auVar206._0_16_);
                        (**(code **)(local_5c0._0_8_ + 0x40))(&local_650);
                        auVar210 = ZEXT3264(local_580);
                        auVar221 = ZEXT3264(_local_560);
                        auVar222 = ZEXT3264(local_5e0);
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar225 = ZEXT1664(auVar93);
                        auVar224 = ZEXT3264(local_540);
                        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar223 = ZEXT3264(auVar100);
                        sVar80 = local_610;
                      }
                      if (local_600 == (undefined1  [32])0x0) {
LAB_01cbe5d1:
                        *(int *)(ray + sVar80 * 4 + 0x100) = auVar221._0_4_;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(local_5c0._0_8_ + 0x3e) & 0x40) != 0)))) {
                          auVar196 = ZEXT1664(auVar196._0_16_);
                          auVar203 = ZEXT1664(auVar203._0_16_);
                          auVar206 = ZEXT1664(auVar206._0_16_);
                          (*p_Var12)(&local_650);
                          auVar210 = ZEXT3264(local_580);
                          auVar221 = ZEXT3264(_local_560);
                          auVar222 = ZEXT3264(local_5e0);
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar225 = ZEXT1664(auVar93);
                          auVar224 = ZEXT3264(local_540);
                          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar223 = ZEXT3264(auVar100);
                          sVar80 = local_610;
                        }
                        if (local_600 == (undefined1  [32])0x0) goto LAB_01cbe5d1;
                        uVar76 = vptestmd_avx512vl(local_600,local_600);
                        iVar1 = *(int *)(local_650.hit + 4);
                        iVar2 = *(int *)(local_650.hit + 8);
                        iVar67 = *(int *)(local_650.hit + 0xc);
                        iVar68 = *(int *)(local_650.hit + 0x10);
                        iVar69 = *(int *)(local_650.hit + 0x14);
                        iVar70 = *(int *)(local_650.hit + 0x18);
                        iVar71 = *(int *)(local_650.hit + 0x1c);
                        bVar81 = (byte)uVar76;
                        bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar19 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_650.ray + 0x180) =
                             (uint)(bVar81 & 1) * *(int *)local_650.hit |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_650.ray + 0x180);
                        *(uint *)(local_650.ray + 0x184) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_650.ray + 0x184);
                        *(uint *)(local_650.ray + 0x188) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_650.ray + 0x188);
                        *(uint *)(local_650.ray + 0x18c) =
                             (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_650.ray + 0x18c)
                        ;
                        *(uint *)(local_650.ray + 400) =
                             (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_650.ray + 400);
                        *(uint *)(local_650.ray + 0x194) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_650.ray + 0x194)
                        ;
                        *(uint *)(local_650.ray + 0x198) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_650.ray + 0x198)
                        ;
                        *(uint *)(local_650.ray + 0x19c) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_650.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_650.hit + 0x24);
                        iVar2 = *(int *)(local_650.hit + 0x28);
                        iVar67 = *(int *)(local_650.hit + 0x2c);
                        iVar68 = *(int *)(local_650.hit + 0x30);
                        iVar69 = *(int *)(local_650.hit + 0x34);
                        iVar70 = *(int *)(local_650.hit + 0x38);
                        iVar71 = *(int *)(local_650.hit + 0x3c);
                        bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar19 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_650.ray + 0x1a0) =
                             (uint)(bVar81 & 1) * *(int *)(local_650.hit + 0x20) |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_650.ray + 0x1a0);
                        *(uint *)(local_650.ray + 0x1a4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_650.ray + 0x1a4);
                        *(uint *)(local_650.ray + 0x1a8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1a8);
                        *(uint *)(local_650.ray + 0x1ac) =
                             (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1ac)
                        ;
                        *(uint *)(local_650.ray + 0x1b0) =
                             (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1b0)
                        ;
                        *(uint *)(local_650.ray + 0x1b4) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_650.ray + 0x1b4)
                        ;
                        *(uint *)(local_650.ray + 0x1b8) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_650.ray + 0x1b8)
                        ;
                        *(uint *)(local_650.ray + 0x1bc) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_650.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_650.hit + 0x44);
                        iVar2 = *(int *)(local_650.hit + 0x48);
                        iVar67 = *(int *)(local_650.hit + 0x4c);
                        iVar68 = *(int *)(local_650.hit + 0x50);
                        iVar69 = *(int *)(local_650.hit + 0x54);
                        iVar70 = *(int *)(local_650.hit + 0x58);
                        iVar71 = *(int *)(local_650.hit + 0x5c);
                        bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar19 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_650.ray + 0x1c0) =
                             (uint)(bVar81 & 1) * *(int *)(local_650.hit + 0x40) |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_650.ray + 0x1c0);
                        *(uint *)(local_650.ray + 0x1c4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_650.ray + 0x1c4);
                        *(uint *)(local_650.ray + 0x1c8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1c8);
                        *(uint *)(local_650.ray + 0x1cc) =
                             (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1cc)
                        ;
                        *(uint *)(local_650.ray + 0x1d0) =
                             (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1d0)
                        ;
                        *(uint *)(local_650.ray + 0x1d4) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_650.ray + 0x1d4)
                        ;
                        *(uint *)(local_650.ray + 0x1d8) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_650.ray + 0x1d8)
                        ;
                        *(uint *)(local_650.ray + 0x1dc) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_650.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_650.hit + 100);
                        iVar2 = *(int *)(local_650.hit + 0x68);
                        iVar67 = *(int *)(local_650.hit + 0x6c);
                        iVar68 = *(int *)(local_650.hit + 0x70);
                        iVar69 = *(int *)(local_650.hit + 0x74);
                        iVar70 = *(int *)(local_650.hit + 0x78);
                        iVar71 = *(int *)(local_650.hit + 0x7c);
                        bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar19 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_650.ray + 0x1e0) =
                             (uint)(bVar81 & 1) * *(int *)(local_650.hit + 0x60) |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_650.ray + 0x1e0);
                        *(uint *)(local_650.ray + 0x1e4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_650.ray + 0x1e4);
                        *(uint *)(local_650.ray + 0x1e8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1e8);
                        *(uint *)(local_650.ray + 0x1ec) =
                             (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1ec)
                        ;
                        *(uint *)(local_650.ray + 0x1f0) =
                             (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1f0)
                        ;
                        *(uint *)(local_650.ray + 500) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_650.ray + 500);
                        *(uint *)(local_650.ray + 0x1f8) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_650.ray + 0x1f8)
                        ;
                        *(uint *)(local_650.ray + 0x1fc) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_650.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_650.hit + 0x84);
                        iVar2 = *(int *)(local_650.hit + 0x88);
                        iVar67 = *(int *)(local_650.hit + 0x8c);
                        iVar68 = *(int *)(local_650.hit + 0x90);
                        iVar69 = *(int *)(local_650.hit + 0x94);
                        iVar70 = *(int *)(local_650.hit + 0x98);
                        iVar71 = *(int *)(local_650.hit + 0x9c);
                        bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar19 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_650.ray + 0x200) =
                             (uint)(bVar81 & 1) * *(int *)(local_650.hit + 0x80) |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_650.ray + 0x200);
                        *(uint *)(local_650.ray + 0x204) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_650.ray + 0x204);
                        *(uint *)(local_650.ray + 0x208) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_650.ray + 0x208);
                        *(uint *)(local_650.ray + 0x20c) =
                             (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_650.ray + 0x20c)
                        ;
                        *(uint *)(local_650.ray + 0x210) =
                             (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_650.ray + 0x210)
                        ;
                        *(uint *)(local_650.ray + 0x214) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_650.ray + 0x214)
                        ;
                        *(uint *)(local_650.ray + 0x218) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_650.ray + 0x218)
                        ;
                        *(uint *)(local_650.ray + 0x21c) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_650.ray + 0x21c)
                        ;
                        auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xa0));
                        *(undefined1 (*) [32])(local_650.ray + 0x220) = auVar100;
                        auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xc0));
                        *(undefined1 (*) [32])(local_650.ray + 0x240) = auVar100;
                        auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xe0));
                        *(undefined1 (*) [32])(local_650.ray + 0x260) = auVar100;
                        auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_650.ray + 0x280) = auVar100;
                        auVar221 = ZEXT464(*(uint *)(ray + sVar80 * 4 + 0x100));
                      }
                      auVar106 = auVar222._0_32_;
                      bVar81 = ~(byte)(1 << ((uint)uVar73 & 0x1f)) & (byte)uVar82;
                      uVar144 = auVar221._0_4_;
                      auVar156._4_4_ = uVar144;
                      auVar156._0_4_ = uVar144;
                      auVar156._8_4_ = uVar144;
                      auVar156._12_4_ = uVar144;
                      auVar156._16_4_ = uVar144;
                      auVar156._20_4_ = uVar144;
                      auVar156._24_4_ = uVar144;
                      auVar156._28_4_ = uVar144;
                      uVar163 = vcmpps_avx512vl(auVar210._0_32_,auVar156,2);
                      if ((bVar81 & (byte)uVar163) == 0) goto LAB_01cbd49d;
                      bVar81 = bVar81 & (byte)uVar163;
                      uVar82 = (ulong)bVar81;
                      auVar157._8_4_ = 0x7f800000;
                      auVar157._0_8_ = 0x7f8000007f800000;
                      auVar157._12_4_ = 0x7f800000;
                      auVar157._16_4_ = 0x7f800000;
                      auVar157._20_4_ = 0x7f800000;
                      auVar157._24_4_ = 0x7f800000;
                      auVar157._28_4_ = 0x7f800000;
                      auVar100 = vblendmps_avx512vl(auVar157,auVar210._0_32_);
                      auVar134._0_4_ =
                           (uint)(bVar81 & 1) * auVar100._0_4_ |
                           (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                      bVar13 = (bool)(bVar81 >> 1 & 1);
                      auVar134._4_4_ = (uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar81 >> 2 & 1);
                      auVar134._8_4_ = (uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar81 >> 3 & 1);
                      auVar134._12_4_ = (uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar81 >> 4 & 1);
                      auVar134._16_4_ = (uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar81 >> 5 & 1);
                      auVar134._20_4_ = (uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar81 >> 6 & 1);
                      auVar134._24_4_ = (uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * 0x7f800000;
                      auVar134._28_4_ =
                           (uint)(bVar81 >> 7) * auVar100._28_4_ |
                           (uint)!(bool)(bVar81 >> 7) * 0x7f800000;
                      auVar100 = vshufps_avx(auVar134,auVar134,0xb1);
                      auVar100 = vminps_avx(auVar134,auVar100);
                      auVar97 = vshufpd_avx(auVar100,auVar100,5);
                      auVar100 = vminps_avx(auVar100,auVar97);
                      auVar97 = vpermpd_avx2(auVar100,0x4e);
                      auVar100 = vminps_avx(auVar100,auVar97);
                      uVar163 = vcmpps_avx512vl(auVar134,auVar100,0);
                      bVar72 = (byte)uVar163 & bVar81;
                      if (bVar72 != 0) {
                        bVar81 = bVar72;
                      }
                      uVar74 = 0;
                      for (uVar75 = (uint)bVar81; (uVar75 & 1) == 0;
                          uVar75 = uVar75 >> 1 | 0x80000000) {
                        uVar74 = uVar74 + 1;
                      }
                      uVar73 = (ulong)uVar74;
                    } while( true );
                  }
                  fVar168 = local_320[uVar73];
                  uVar144 = *(undefined4 *)(local_300 + uVar73 * 4);
                  fVar161 = 1.0 - fVar168;
                  auVar23._8_4_ = 0x80000000;
                  auVar23._0_8_ = 0x8000000080000000;
                  auVar23._12_4_ = 0x80000000;
                  auVar89 = vxorps_avx512vl(ZEXT416((uint)fVar161),auVar23);
                  auVar93 = ZEXT416((uint)(fVar168 * fVar161 * 4.0));
                  auVar88 = vfnmsub213ss_fma(ZEXT416((uint)fVar168),ZEXT416((uint)fVar168),auVar93);
                  auVar93 = vfmadd213ss_fma(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),auVar93);
                  fVar161 = fVar161 * auVar89._0_4_ * 0.5;
                  fVar162 = auVar88._0_4_ * 0.5;
                  auVar203 = ZEXT464((uint)fVar162);
                  fVar178 = auVar93._0_4_ * 0.5;
                  fVar179 = fVar168 * fVar168 * 0.5;
                  auVar184._0_4_ = fVar179 * fVar143;
                  auVar184._4_4_ = fVar179 * fVar158;
                  auVar184._8_4_ = fVar179 * fVar159;
                  auVar184._12_4_ = fVar179 * fVar160;
                  auVar172._4_4_ = fVar178;
                  auVar172._0_4_ = fVar178;
                  auVar172._8_4_ = fVar178;
                  auVar172._12_4_ = fVar178;
                  auVar93 = vfmadd132ps_fma(auVar172,auVar184,auVar6);
                  auVar185._4_4_ = fVar162;
                  auVar185._0_4_ = fVar162;
                  auVar185._8_4_ = fVar162;
                  auVar185._12_4_ = fVar162;
                  auVar93 = vfmadd132ps_fma(auVar185,auVar93,auVar20);
                  auVar196 = ZEXT1664(auVar93);
                  auVar173._4_4_ = fVar161;
                  auVar173._0_4_ = fVar161;
                  auVar173._8_4_ = fVar161;
                  auVar173._12_4_ = fVar161;
                  auVar93 = vfmadd213ps_fma(auVar173,auVar85,auVar93);
                  *(undefined4 *)(ray + sVar80 * 4 + 0x100) =
                       *(undefined4 *)(local_2e0 + uVar73 * 4);
                  *(int *)(ray + sVar80 * 4 + 0x180) = auVar93._0_4_;
                  uVar10 = vextractps_avx(auVar93,1);
                  *(undefined4 *)(ray + sVar80 * 4 + 0x1a0) = uVar10;
                  uVar10 = vextractps_avx(auVar93,2);
                  *(undefined4 *)(ray + sVar80 * 4 + 0x1c0) = uVar10;
                  *(float *)(ray + sVar80 * 4 + 0x1e0) = fVar168;
                  *(undefined4 *)(ray + sVar80 * 4 + 0x200) = uVar144;
                  *(undefined4 *)(ray + sVar80 * 4 + 0x220) = uVar3;
                  *(uint *)(ray + sVar80 * 4 + 0x240) = uVar78;
                  *(uint *)(ray + sVar80 * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + sVar80 * 4 + 0x280) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01cbd49d:
      if (8 < iVar9) {
        local_5c0 = vpbroadcastd_avx512vl();
        local_560._4_4_ = fVar169;
        local_560._0_4_ = fVar169;
        fStack_558 = fVar169;
        fStack_554 = fVar169;
        fStack_550 = fVar169;
        fStack_54c = fVar169;
        fStack_548 = fVar169;
        fStack_544 = fVar169;
        local_500._4_4_ = local_5a0._0_4_;
        local_500._0_4_ = local_5a0._0_4_;
        local_500._8_4_ = local_5a0._0_4_;
        local_500._12_4_ = local_5a0._0_4_;
        local_500._16_4_ = local_5a0._0_4_;
        local_500._20_4_ = local_5a0._0_4_;
        local_500._24_4_ = local_5a0._0_4_;
        local_500._28_4_ = local_5a0._0_4_;
        local_100 = 1.0 / (float)local_620._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        local_520 = vpbroadcastd_avx512vl();
        local_580 = vpbroadcastd_avx512vl();
        lVar77 = 8;
        local_5e0 = auVar106;
LAB_01cbd543:
        auVar100 = vpbroadcastd_avx512vl();
        auVar100 = vpor_avx2(auVar100,_DAT_01fe9900);
        uVar21 = vpcmpd_avx512vl(auVar100,local_5c0,1);
        auVar100 = *(undefined1 (*) [32])(bspline_basis0 + lVar77 * 4 + lVar22);
        auVar97 = *(undefined1 (*) [32])(lVar22 + 0x21aefac + lVar77 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar22 + 0x21af430 + lVar77 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar22 + 0x21af8b4 + lVar77 * 4);
        auVar222._0_4_ = auVar99._0_4_ * (float)local_4c0._0_4_;
        auVar222._4_4_ = auVar99._4_4_ * (float)local_4c0._4_4_;
        auVar222._8_4_ = auVar99._8_4_ * fStack_4b8;
        auVar222._12_4_ = auVar99._12_4_ * fStack_4b4;
        auVar222._16_4_ = auVar99._16_4_ * fStack_4b0;
        auVar222._20_4_ = auVar99._20_4_ * fStack_4ac;
        auVar222._28_36_ = auVar203._28_36_;
        auVar222._24_4_ = auVar99._24_4_ * fStack_4a8;
        auVar203._0_4_ = auVar99._0_4_ * (float)local_4e0._0_4_;
        auVar203._4_4_ = auVar99._4_4_ * (float)local_4e0._4_4_;
        auVar203._8_4_ = auVar99._8_4_ * fStack_4d8;
        auVar203._12_4_ = auVar99._12_4_ * fStack_4d4;
        auVar203._16_4_ = auVar99._16_4_ * fStack_4d0;
        auVar203._20_4_ = auVar99._20_4_ * fStack_4cc;
        auVar203._28_36_ = auVar196._28_36_;
        auVar203._24_4_ = auVar99._24_4_ * fStack_4c8;
        auVar102 = vmulps_avx512vl(local_e0,auVar99);
        auVar101 = vfmadd231ps_avx512vl(auVar222._0_32_,auVar98,local_480);
        auVar109 = vfmadd231ps_avx512vl(auVar203._0_32_,auVar98,local_4a0);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,local_c0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_440);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar97,local_460);
        auVar108 = vfmadd231ps_avx512vl(auVar102,auVar97,local_a0);
        auVar93 = vfmadd231ps_fma(auVar101,auVar100,local_400);
        auVar203 = ZEXT1664(auVar93);
        auVar88 = vfmadd231ps_fma(auVar109,auVar100,local_420);
        auVar196 = ZEXT1664(auVar88);
        auVar102 = *(undefined1 (*) [32])(bspline_basis1 + lVar77 * 4 + lVar22);
        auVar101 = *(undefined1 (*) [32])(lVar22 + 0x21b13cc + lVar77 * 4);
        auVar96 = vfmadd231ps_avx512vl(auVar108,auVar100,local_80);
        auVar109 = *(undefined1 (*) [32])(lVar22 + 0x21b1850 + lVar77 * 4);
        auVar108 = *(undefined1 (*) [32])(lVar22 + 0x21b1cd4 + lVar77 * 4);
        auVar210._0_4_ = auVar108._0_4_ * (float)local_4c0._0_4_;
        auVar210._4_4_ = auVar108._4_4_ * (float)local_4c0._4_4_;
        auVar210._8_4_ = auVar108._8_4_ * fStack_4b8;
        auVar210._12_4_ = auVar108._12_4_ * fStack_4b4;
        auVar210._16_4_ = auVar108._16_4_ * fStack_4b0;
        auVar210._20_4_ = auVar108._20_4_ * fStack_4ac;
        auVar210._28_36_ = auVar206._28_36_;
        auVar210._24_4_ = auVar108._24_4_ * fStack_4a8;
        auVar49._4_4_ = auVar108._4_4_ * (float)local_4e0._4_4_;
        auVar49._0_4_ = auVar108._0_4_ * (float)local_4e0._0_4_;
        auVar49._8_4_ = auVar108._8_4_ * fStack_4d8;
        auVar49._12_4_ = auVar108._12_4_ * fStack_4d4;
        auVar49._16_4_ = auVar108._16_4_ * fStack_4d0;
        auVar49._20_4_ = auVar108._20_4_ * fStack_4cc;
        auVar49._24_4_ = auVar108._24_4_ * fStack_4c8;
        auVar49._28_4_ = uStack_4c4;
        auVar103 = vmulps_avx512vl(local_e0,auVar108);
        auVar104 = vfmadd231ps_avx512vl(auVar210._0_32_,auVar109,local_480);
        auVar105 = vfmadd231ps_avx512vl(auVar49,auVar109,local_4a0);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,local_c0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,local_440);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar101,local_460);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar101,local_a0);
        auVar89 = vfmadd231ps_fma(auVar104,auVar102,local_400);
        auVar206 = ZEXT1664(auVar89);
        auVar87 = vfmadd231ps_fma(auVar105,auVar102,local_420);
        auVar105 = vfmadd231ps_avx512vl(auVar103,auVar102,local_80);
        auVar106 = vmaxps_avx512vl(auVar96,auVar105);
        auVar103 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar93));
        auVar104 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar88));
        auVar94 = vmulps_avx512vl(ZEXT1632(auVar88),auVar103);
        auVar95 = vmulps_avx512vl(ZEXT1632(auVar93),auVar104);
        auVar94 = vsubps_avx512vl(auVar94,auVar95);
        auVar95 = vmulps_avx512vl(auVar104,auVar104);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar103,auVar103);
        auVar106 = vmulps_avx512vl(auVar106,auVar106);
        auVar106 = vmulps_avx512vl(auVar106,auVar95);
        auVar94 = vmulps_avx512vl(auVar94,auVar94);
        uVar163 = vcmpps_avx512vl(auVar94,auVar106,2);
        bVar81 = (byte)uVar21 & (byte)uVar163;
        if (bVar81 != 0) {
          auVar108 = vmulps_avx512vl(local_280,auVar108);
          auVar109 = vfmadd213ps_avx512vl(auVar109,local_260,auVar108);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_240,auVar109);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_5e0,auVar101);
          auVar99 = vmulps_avx512vl(local_280,auVar99);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_260,auVar99);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_240,auVar98);
          auVar101 = vfmadd213ps_avx512vl(auVar100,local_5e0,auVar97);
          auVar100 = *(undefined1 (*) [32])(lVar22 + 0x21afd38 + lVar77 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar22 + 0x21b01bc + lVar77 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar22 + 0x21b0640 + lVar77 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar22 + 0x21b0ac4 + lVar77 * 4);
          auVar109 = vmulps_avx512vl(_local_4c0,auVar99);
          auVar108 = vmulps_avx512vl(_local_4e0,auVar99);
          auVar99 = vmulps_avx512vl(local_280,auVar99);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar98,local_480);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar98,local_4a0);
          auVar98 = vfmadd231ps_avx512vl(auVar99,local_260,auVar98);
          auVar99 = vfmadd231ps_avx512vl(auVar109,auVar97,local_440);
          auVar109 = vfmadd231ps_avx512vl(auVar108,auVar97,local_460);
          auVar97 = vfmadd231ps_avx512vl(auVar98,local_240,auVar97);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar100,local_400);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar100,local_420);
          auVar86 = vfmadd231ps_fma(auVar97,auVar100,local_5e0);
          auVar100 = *(undefined1 (*) [32])(lVar22 + 0x21b2158 + lVar77 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar22 + 0x21b2a60 + lVar77 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar22 + 0x21b2ee4 + lVar77 * 4);
          auVar108 = vmulps_avx512vl(_local_4c0,auVar98);
          auVar106 = vmulps_avx512vl(_local_4e0,auVar98);
          auVar98 = vmulps_avx512vl(local_280,auVar98);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar97,local_480);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,local_4a0);
          auVar98 = vfmadd231ps_avx512vl(auVar98,local_260,auVar97);
          auVar97 = *(undefined1 (*) [32])(lVar22 + 0x21b25dc + lVar77 * 4);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar97,local_440);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,local_460);
          auVar97 = vfmadd231ps_avx512vl(auVar98,local_240,auVar97);
          auVar98 = vfmadd231ps_avx512vl(auVar108,auVar100,local_400);
          auVar108 = vfmadd231ps_avx512vl(auVar106,auVar100,local_420);
          auVar97 = vfmadd231ps_avx512vl(auVar97,local_5e0,auVar100);
          auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar99,auVar106);
          vandps_avx512vl(auVar109,auVar106);
          auVar100 = vmaxps_avx(auVar106,auVar106);
          vandps_avx512vl(ZEXT1632(auVar86),auVar106);
          auVar100 = vmaxps_avx(auVar100,auVar106);
          uVar73 = vcmpps_avx512vl(auVar100,_local_560,1);
          bVar13 = (bool)((byte)uVar73 & 1);
          auVar122._0_4_ = (float)((uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar99._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar99._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar99._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar99._12_4_)
          ;
          bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar122._16_4_ = (float)((uint)bVar13 * auVar103._16_4_ | (uint)!bVar13 * auVar99._16_4_)
          ;
          bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar122._20_4_ = (float)((uint)bVar13 * auVar103._20_4_ | (uint)!bVar13 * auVar99._20_4_)
          ;
          bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar122._24_4_ = (float)((uint)bVar13 * auVar103._24_4_ | (uint)!bVar13 * auVar99._24_4_)
          ;
          bVar13 = SUB81(uVar73 >> 7,0);
          auVar122._28_4_ = (uint)bVar13 * auVar103._28_4_ | (uint)!bVar13 * auVar99._28_4_;
          bVar13 = (bool)((byte)uVar73 & 1);
          auVar123._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar109._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar109._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar109._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar123._12_4_ =
               (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar109._12_4_);
          bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar123._16_4_ =
               (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar109._16_4_);
          bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar123._20_4_ =
               (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar109._20_4_);
          bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar123._24_4_ =
               (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar109._24_4_);
          bVar13 = SUB81(uVar73 >> 7,0);
          auVar123._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar109._28_4_;
          vandps_avx512vl(auVar98,auVar106);
          vandps_avx512vl(auVar108,auVar106);
          auVar100 = vmaxps_avx(auVar123,auVar123);
          vandps_avx512vl(auVar97,auVar106);
          auVar100 = vmaxps_avx(auVar100,auVar123);
          uVar73 = vcmpps_avx512vl(auVar100,_local_560,1);
          bVar13 = (bool)((byte)uVar73 & 1);
          auVar124._0_4_ = (uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar98._0_4_;
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar98._4_4_;
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar98._8_4_;
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar98._12_4_;
          bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar13 * auVar103._16_4_ | (uint)!bVar13 * auVar98._16_4_;
          bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar13 * auVar103._20_4_ | (uint)!bVar13 * auVar98._20_4_;
          bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar13 * auVar103._24_4_ | (uint)!bVar13 * auVar98._24_4_;
          bVar13 = SUB81(uVar73 >> 7,0);
          auVar124._28_4_ = (uint)bVar13 * auVar103._28_4_ | (uint)!bVar13 * auVar98._28_4_;
          bVar13 = (bool)((byte)uVar73 & 1);
          auVar125._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar108._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar108._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar108._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar125._12_4_ =
               (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar108._12_4_);
          bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar125._16_4_ =
               (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar108._16_4_);
          bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar125._20_4_ =
               (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar108._20_4_);
          bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar125._24_4_ =
               (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar108._24_4_);
          bVar13 = SUB81(uVar73 >> 7,0);
          auVar125._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar108._28_4_;
          auVar209._8_4_ = 0x80000000;
          auVar209._0_8_ = 0x8000000080000000;
          auVar209._12_4_ = 0x80000000;
          auVar209._16_4_ = 0x80000000;
          auVar209._20_4_ = 0x80000000;
          auVar209._24_4_ = 0x80000000;
          auVar209._28_4_ = 0x80000000;
          auVar100 = vxorps_avx512vl(auVar124,auVar209);
          auVar92 = vxorps_avx512vl(auVar106._0_16_,auVar106._0_16_);
          auVar97 = vfmadd213ps_avx512vl(auVar122,auVar122,ZEXT1632(auVar92));
          auVar86 = vfmadd231ps_fma(auVar97,auVar123,auVar123);
          auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
          auVar219._8_4_ = 0xbf000000;
          auVar219._0_8_ = 0xbf000000bf000000;
          auVar219._12_4_ = 0xbf000000;
          auVar219._16_4_ = 0xbf000000;
          auVar219._20_4_ = 0xbf000000;
          auVar219._24_4_ = 0xbf000000;
          auVar219._28_4_ = 0xbf000000;
          fVar169 = auVar97._0_4_;
          fVar168 = auVar97._4_4_;
          fVar161 = auVar97._8_4_;
          fVar162 = auVar97._12_4_;
          fVar178 = auVar97._16_4_;
          fVar179 = auVar97._20_4_;
          fVar183 = auVar97._24_4_;
          auVar50._4_4_ = fVar168 * fVar168 * fVar168 * auVar86._4_4_ * -0.5;
          auVar50._0_4_ = fVar169 * fVar169 * fVar169 * auVar86._0_4_ * -0.5;
          auVar50._8_4_ = fVar161 * fVar161 * fVar161 * auVar86._8_4_ * -0.5;
          auVar50._12_4_ = fVar162 * fVar162 * fVar162 * auVar86._12_4_ * -0.5;
          auVar50._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
          auVar50._20_4_ = fVar179 * fVar179 * fVar179 * -0.0;
          auVar50._24_4_ = fVar183 * fVar183 * fVar183 * -0.0;
          auVar50._28_4_ = auVar123._28_4_;
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar97 = vfmadd231ps_avx512vl(auVar50,auVar98,auVar97);
          auVar51._4_4_ = auVar123._4_4_ * auVar97._4_4_;
          auVar51._0_4_ = auVar123._0_4_ * auVar97._0_4_;
          auVar51._8_4_ = auVar123._8_4_ * auVar97._8_4_;
          auVar51._12_4_ = auVar123._12_4_ * auVar97._12_4_;
          auVar51._16_4_ = auVar123._16_4_ * auVar97._16_4_;
          auVar51._20_4_ = auVar123._20_4_ * auVar97._20_4_;
          auVar51._24_4_ = auVar123._24_4_ * auVar97._24_4_;
          auVar51._28_4_ = 0;
          auVar52._4_4_ = auVar97._4_4_ * -auVar122._4_4_;
          auVar52._0_4_ = auVar97._0_4_ * -auVar122._0_4_;
          auVar52._8_4_ = auVar97._8_4_ * -auVar122._8_4_;
          auVar52._12_4_ = auVar97._12_4_ * -auVar122._12_4_;
          auVar52._16_4_ = auVar97._16_4_ * -auVar122._16_4_;
          auVar52._20_4_ = auVar97._20_4_ * -auVar122._20_4_;
          auVar52._24_4_ = auVar97._24_4_ * -auVar122._24_4_;
          auVar52._28_4_ = auVar123._28_4_;
          auVar99 = vmulps_avx512vl(auVar97,ZEXT1632(auVar92));
          auVar108 = ZEXT1632(auVar92);
          auVar97 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar108);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar125,auVar125);
          auVar109 = vrsqrt14ps_avx512vl(auVar97);
          auVar97 = vmulps_avx512vl(auVar97,auVar219);
          fVar169 = auVar109._0_4_;
          fVar168 = auVar109._4_4_;
          fVar161 = auVar109._8_4_;
          fVar162 = auVar109._12_4_;
          fVar178 = auVar109._16_4_;
          fVar179 = auVar109._20_4_;
          fVar183 = auVar109._24_4_;
          auVar53._4_4_ = fVar168 * fVar168 * fVar168 * auVar97._4_4_;
          auVar53._0_4_ = fVar169 * fVar169 * fVar169 * auVar97._0_4_;
          auVar53._8_4_ = fVar161 * fVar161 * fVar161 * auVar97._8_4_;
          auVar53._12_4_ = fVar162 * fVar162 * fVar162 * auVar97._12_4_;
          auVar53._16_4_ = fVar178 * fVar178 * fVar178 * auVar97._16_4_;
          auVar53._20_4_ = fVar179 * fVar179 * fVar179 * auVar97._20_4_;
          auVar53._24_4_ = fVar183 * fVar183 * fVar183 * auVar97._24_4_;
          auVar53._28_4_ = auVar97._28_4_;
          auVar97 = vfmadd231ps_avx512vl(auVar53,auVar98,auVar109);
          auVar54._4_4_ = auVar125._4_4_ * auVar97._4_4_;
          auVar54._0_4_ = auVar125._0_4_ * auVar97._0_4_;
          auVar54._8_4_ = auVar125._8_4_ * auVar97._8_4_;
          auVar54._12_4_ = auVar125._12_4_ * auVar97._12_4_;
          auVar54._16_4_ = auVar125._16_4_ * auVar97._16_4_;
          auVar54._20_4_ = auVar125._20_4_ * auVar97._20_4_;
          auVar54._24_4_ = auVar125._24_4_ * auVar97._24_4_;
          auVar54._28_4_ = auVar109._28_4_;
          auVar55._4_4_ = auVar97._4_4_ * auVar100._4_4_;
          auVar55._0_4_ = auVar97._0_4_ * auVar100._0_4_;
          auVar55._8_4_ = auVar97._8_4_ * auVar100._8_4_;
          auVar55._12_4_ = auVar97._12_4_ * auVar100._12_4_;
          auVar55._16_4_ = auVar97._16_4_ * auVar100._16_4_;
          auVar55._20_4_ = auVar97._20_4_ * auVar100._20_4_;
          auVar55._24_4_ = auVar97._24_4_ * auVar100._24_4_;
          auVar55._28_4_ = auVar100._28_4_;
          auVar100 = vmulps_avx512vl(auVar97,auVar108);
          auVar86 = vfmadd213ps_fma(auVar51,auVar96,ZEXT1632(auVar93));
          auVar7 = vfmadd213ps_fma(auVar52,auVar96,ZEXT1632(auVar88));
          auVar98 = vfmadd213ps_avx512vl(auVar99,auVar96,auVar101);
          auVar109 = vfmadd213ps_avx512vl(auVar54,auVar105,ZEXT1632(auVar89));
          auVar171 = vfnmadd213ps_fma(auVar51,auVar96,ZEXT1632(auVar93));
          auVar93 = vfmadd213ps_fma(auVar55,auVar105,ZEXT1632(auVar87));
          auVar180 = vfnmadd213ps_fma(auVar52,auVar96,ZEXT1632(auVar88));
          auVar88 = vfmadd213ps_fma(auVar100,auVar105,auVar102);
          auVar207 = vfnmadd231ps_fma(auVar101,auVar96,auVar99);
          auVar181 = vfnmadd213ps_fma(auVar54,auVar105,ZEXT1632(auVar89));
          auVar90 = vfnmadd213ps_fma(auVar55,auVar105,ZEXT1632(auVar87));
          auVar91 = vfnmadd231ps_fma(auVar102,auVar105,auVar100);
          auVar102 = vsubps_avx512vl(auVar109,ZEXT1632(auVar171));
          auVar100 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar180));
          auVar97 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar207));
          auVar56._4_4_ = auVar100._4_4_ * auVar207._4_4_;
          auVar56._0_4_ = auVar100._0_4_ * auVar207._0_4_;
          auVar56._8_4_ = auVar100._8_4_ * auVar207._8_4_;
          auVar56._12_4_ = auVar100._12_4_ * auVar207._12_4_;
          auVar56._16_4_ = auVar100._16_4_ * 0.0;
          auVar56._20_4_ = auVar100._20_4_ * 0.0;
          auVar56._24_4_ = auVar100._24_4_ * 0.0;
          auVar56._28_4_ = auVar99._28_4_;
          auVar89 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar180),auVar97);
          auVar57._4_4_ = auVar97._4_4_ * auVar171._4_4_;
          auVar57._0_4_ = auVar97._0_4_ * auVar171._0_4_;
          auVar57._8_4_ = auVar97._8_4_ * auVar171._8_4_;
          auVar57._12_4_ = auVar97._12_4_ * auVar171._12_4_;
          auVar57._16_4_ = auVar97._16_4_ * 0.0;
          auVar57._20_4_ = auVar97._20_4_ * 0.0;
          auVar57._24_4_ = auVar97._24_4_ * 0.0;
          auVar57._28_4_ = auVar97._28_4_;
          auVar87 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar207),auVar102);
          auVar58._4_4_ = auVar180._4_4_ * auVar102._4_4_;
          auVar58._0_4_ = auVar180._0_4_ * auVar102._0_4_;
          auVar58._8_4_ = auVar180._8_4_ * auVar102._8_4_;
          auVar58._12_4_ = auVar180._12_4_ * auVar102._12_4_;
          auVar58._16_4_ = auVar102._16_4_ * 0.0;
          auVar58._20_4_ = auVar102._20_4_ * 0.0;
          auVar58._24_4_ = auVar102._24_4_ * 0.0;
          auVar58._28_4_ = auVar102._28_4_;
          auVar170 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar171),auVar100);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar170),auVar108,ZEXT1632(auVar87));
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,ZEXT1632(auVar89));
          auVar94 = ZEXT1632(auVar92);
          uVar73 = vcmpps_avx512vl(auVar100,auVar94,2);
          bVar72 = (byte)uVar73;
          fVar135 = (float)((uint)(bVar72 & 1) * auVar86._0_4_ |
                           (uint)!(bool)(bVar72 & 1) * auVar181._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          fVar137 = (float)((uint)bVar13 * auVar86._4_4_ | (uint)!bVar13 * auVar181._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          fVar139 = (float)((uint)bVar13 * auVar86._8_4_ | (uint)!bVar13 * auVar181._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          fVar141 = (float)((uint)bVar13 * auVar86._12_4_ | (uint)!bVar13 * auVar181._12_4_);
          auVar108 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar139,CONCAT44(fVar137,fVar135))));
          fVar136 = (float)((uint)(bVar72 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar72 & 1) * auVar90._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          fVar138 = (float)((uint)bVar13 * auVar7._4_4_ | (uint)!bVar13 * auVar90._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          fVar140 = (float)((uint)bVar13 * auVar7._8_4_ | (uint)!bVar13 * auVar90._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          fVar142 = (float)((uint)bVar13 * auVar7._12_4_ | (uint)!bVar13 * auVar90._12_4_);
          auVar103 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar136))));
          auVar126._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar98._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar91._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar91._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar91._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar91._12_4_);
          fVar169 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar98._16_4_);
          auVar126._16_4_ = fVar169;
          fVar161 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar98._20_4_);
          auVar126._20_4_ = fVar161;
          fVar168 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar98._24_4_);
          auVar126._24_4_ = fVar168;
          iVar1 = (uint)(byte)(uVar73 >> 7) * auVar98._28_4_;
          auVar126._28_4_ = iVar1;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar171),auVar109);
          auVar127._0_4_ =
               (uint)(bVar72 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar89._0_4_;
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar89._4_4_;
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar89._8_4_;
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar89._12_4_;
          auVar127._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar100._16_4_;
          auVar127._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar100._20_4_;
          auVar127._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar100._24_4_;
          auVar127._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar100._28_4_;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar180),ZEXT1632(auVar93));
          auVar128._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar86._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar86._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar86._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar86._12_4_)
          ;
          fVar178 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar100._16_4_);
          auVar128._16_4_ = fVar178;
          fVar179 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar100._20_4_);
          auVar128._20_4_ = fVar179;
          fVar162 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar100._24_4_);
          auVar128._24_4_ = fVar162;
          auVar128._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar100._28_4_;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar207),ZEXT1632(auVar88));
          auVar129._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar7._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar7._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar7._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar7._12_4_);
          fVar84 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar100._16_4_);
          auVar129._16_4_ = fVar84;
          fVar83 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar100._20_4_);
          auVar129._20_4_ = fVar83;
          fVar183 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar100._24_4_);
          auVar129._24_4_ = fVar183;
          iVar2 = (uint)(byte)(uVar73 >> 7) * auVar100._28_4_;
          auVar129._28_4_ = iVar2;
          auVar130._0_4_ =
               (uint)(bVar72 & 1) * (int)auVar171._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar109._0_4_
          ;
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar13 * (int)auVar171._4_4_ | (uint)!bVar13 * auVar109._4_4_;
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar13 * (int)auVar171._8_4_ | (uint)!bVar13 * auVar109._8_4_;
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar13 * (int)auVar171._12_4_ | (uint)!bVar13 * auVar109._12_4_;
          auVar130._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar109._16_4_;
          auVar130._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar109._20_4_;
          auVar130._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar109._24_4_;
          auVar130._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar109._28_4_;
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar73 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar73 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar109 = vsubps_avx512vl(auVar130,auVar108);
          auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar180._12_4_ |
                                                  (uint)!bVar17 * auVar93._12_4_,
                                                  CONCAT48((uint)bVar15 * (int)auVar180._8_4_ |
                                                           (uint)!bVar15 * auVar93._8_4_,
                                                           CONCAT44((uint)bVar13 *
                                                                    (int)auVar180._4_4_ |
                                                                    (uint)!bVar13 * auVar93._4_4_,
                                                                    (uint)(bVar72 & 1) *
                                                                    (int)auVar180._0_4_ |
                                                                    (uint)!(bool)(bVar72 & 1) *
                                                                    auVar93._0_4_)))),auVar103);
          auVar203 = ZEXT3264(auVar97);
          auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar207._12_4_ |
                                                  (uint)!bVar18 * auVar88._12_4_,
                                                  CONCAT48((uint)bVar16 * (int)auVar207._8_4_ |
                                                           (uint)!bVar16 * auVar88._8_4_,
                                                           CONCAT44((uint)bVar14 *
                                                                    (int)auVar207._4_4_ |
                                                                    (uint)!bVar14 * auVar88._4_4_,
                                                                    (uint)(bVar72 & 1) *
                                                                    (int)auVar207._0_4_ |
                                                                    (uint)!(bool)(bVar72 & 1) *
                                                                    auVar88._0_4_)))),auVar126);
          auVar99 = vsubps_avx(auVar108,auVar127);
          auVar206 = ZEXT3264(auVar99);
          auVar102 = vsubps_avx(auVar103,auVar128);
          auVar101 = vsubps_avx(auVar126,auVar129);
          auVar59._4_4_ = auVar98._4_4_ * fVar137;
          auVar59._0_4_ = auVar98._0_4_ * fVar135;
          auVar59._8_4_ = auVar98._8_4_ * fVar139;
          auVar59._12_4_ = auVar98._12_4_ * fVar141;
          auVar59._16_4_ = auVar98._16_4_ * 0.0;
          auVar59._20_4_ = auVar98._20_4_ * 0.0;
          auVar59._24_4_ = auVar98._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar93 = vfmsub231ps_fma(auVar59,auVar126,auVar109);
          auVar182._0_4_ = fVar136 * auVar109._0_4_;
          auVar182._4_4_ = fVar138 * auVar109._4_4_;
          auVar182._8_4_ = fVar140 * auVar109._8_4_;
          auVar182._12_4_ = fVar142 * auVar109._12_4_;
          auVar182._16_4_ = auVar109._16_4_ * 0.0;
          auVar182._20_4_ = auVar109._20_4_ * 0.0;
          auVar182._24_4_ = auVar109._24_4_ * 0.0;
          auVar182._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar182,auVar108,auVar97);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar94,ZEXT1632(auVar93));
          auVar192._0_4_ = auVar97._0_4_ * auVar126._0_4_;
          auVar192._4_4_ = auVar97._4_4_ * auVar126._4_4_;
          auVar192._8_4_ = auVar97._8_4_ * auVar126._8_4_;
          auVar192._12_4_ = auVar97._12_4_ * auVar126._12_4_;
          auVar192._16_4_ = auVar97._16_4_ * fVar169;
          auVar192._20_4_ = auVar97._20_4_ * fVar161;
          auVar192._24_4_ = auVar97._24_4_ * fVar168;
          auVar192._28_4_ = 0;
          auVar93 = vfmsub231ps_fma(auVar192,auVar103,auVar98);
          auVar104 = vfmadd231ps_avx512vl(auVar100,auVar94,ZEXT1632(auVar93));
          auVar100 = vmulps_avx512vl(auVar101,auVar127);
          auVar100 = vfmsub231ps_avx512vl(auVar100,auVar99,auVar129);
          auVar60._4_4_ = auVar102._4_4_ * auVar129._4_4_;
          auVar60._0_4_ = auVar102._0_4_ * auVar129._0_4_;
          auVar60._8_4_ = auVar102._8_4_ * auVar129._8_4_;
          auVar60._12_4_ = auVar102._12_4_ * auVar129._12_4_;
          auVar60._16_4_ = auVar102._16_4_ * fVar84;
          auVar60._20_4_ = auVar102._20_4_ * fVar83;
          auVar60._24_4_ = auVar102._24_4_ * fVar183;
          auVar60._28_4_ = iVar2;
          auVar93 = vfmsub231ps_fma(auVar60,auVar128,auVar101);
          auVar193._0_4_ = auVar128._0_4_ * auVar99._0_4_;
          auVar193._4_4_ = auVar128._4_4_ * auVar99._4_4_;
          auVar193._8_4_ = auVar128._8_4_ * auVar99._8_4_;
          auVar193._12_4_ = auVar128._12_4_ * auVar99._12_4_;
          auVar193._16_4_ = fVar178 * auVar99._16_4_;
          auVar193._20_4_ = fVar179 * auVar99._20_4_;
          auVar193._24_4_ = fVar162 * auVar99._24_4_;
          auVar193._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar193,auVar102,auVar127);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar94,auVar100);
          auVar106 = vfmadd231ps_avx512vl(auVar100,auVar94,ZEXT1632(auVar93));
          auVar196 = ZEXT3264(auVar106);
          auVar100 = vmaxps_avx(auVar104,auVar106);
          uVar163 = vcmpps_avx512vl(auVar100,auVar94,2);
          bVar81 = bVar81 & (byte)uVar163;
          if (bVar81 != 0) {
            uVar144 = *(undefined4 *)(ray + sVar80 * 4 + 0x100);
            auVar220._4_4_ = uVar144;
            auVar220._0_4_ = uVar144;
            auVar220._8_4_ = uVar144;
            auVar220._12_4_ = uVar144;
            auVar220._16_4_ = uVar144;
            auVar220._20_4_ = uVar144;
            auVar220._24_4_ = uVar144;
            auVar220._28_4_ = uVar144;
            auVar210 = ZEXT3264(auVar220);
            auVar61._4_4_ = auVar101._4_4_ * auVar97._4_4_;
            auVar61._0_4_ = auVar101._0_4_ * auVar97._0_4_;
            auVar61._8_4_ = auVar101._8_4_ * auVar97._8_4_;
            auVar61._12_4_ = auVar101._12_4_ * auVar97._12_4_;
            auVar61._16_4_ = auVar101._16_4_ * auVar97._16_4_;
            auVar61._20_4_ = auVar101._20_4_ * auVar97._20_4_;
            auVar61._24_4_ = auVar101._24_4_ * auVar97._24_4_;
            auVar61._28_4_ = auVar100._28_4_;
            auVar87 = vfmsub231ps_fma(auVar61,auVar102,auVar98);
            auVar62._4_4_ = auVar98._4_4_ * auVar99._4_4_;
            auVar62._0_4_ = auVar98._0_4_ * auVar99._0_4_;
            auVar62._8_4_ = auVar98._8_4_ * auVar99._8_4_;
            auVar62._12_4_ = auVar98._12_4_ * auVar99._12_4_;
            auVar62._16_4_ = auVar98._16_4_ * auVar99._16_4_;
            auVar62._20_4_ = auVar98._20_4_ * auVar99._20_4_;
            auVar62._24_4_ = auVar98._24_4_ * auVar99._24_4_;
            auVar62._28_4_ = auVar98._28_4_;
            auVar89 = vfmsub231ps_fma(auVar62,auVar109,auVar101);
            auVar63._4_4_ = auVar102._4_4_ * auVar109._4_4_;
            auVar63._0_4_ = auVar102._0_4_ * auVar109._0_4_;
            auVar63._8_4_ = auVar102._8_4_ * auVar109._8_4_;
            auVar63._12_4_ = auVar102._12_4_ * auVar109._12_4_;
            auVar63._16_4_ = auVar102._16_4_ * auVar109._16_4_;
            auVar63._20_4_ = auVar102._20_4_ * auVar109._20_4_;
            auVar63._24_4_ = auVar102._24_4_ * auVar109._24_4_;
            auVar63._28_4_ = auVar102._28_4_;
            auVar86 = vfmsub231ps_fma(auVar63,auVar99,auVar97);
            auVar93 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar86));
            auVar88 = vfmadd231ps_fma(ZEXT1632(auVar93),ZEXT1632(auVar87),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar100 = vrcp14ps_avx512vl(ZEXT1632(auVar88));
            auVar206 = ZEXT3264(auVar100);
            auVar98 = auVar223._0_32_;
            auVar97 = vfnmadd213ps_avx512vl(auVar100,ZEXT1632(auVar88),auVar98);
            auVar93 = vfmadd132ps_fma(auVar97,auVar100,auVar100);
            auVar203 = ZEXT1664(auVar93);
            auVar64._4_4_ = auVar86._4_4_ * auVar126._4_4_;
            auVar64._0_4_ = auVar86._0_4_ * auVar126._0_4_;
            auVar64._8_4_ = auVar86._8_4_ * auVar126._8_4_;
            auVar64._12_4_ = auVar86._12_4_ * auVar126._12_4_;
            auVar64._16_4_ = fVar169 * 0.0;
            auVar64._20_4_ = fVar161 * 0.0;
            auVar64._24_4_ = fVar168 * 0.0;
            auVar64._28_4_ = iVar1;
            auVar89 = vfmadd231ps_fma(auVar64,auVar103,ZEXT1632(auVar89));
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar108,ZEXT1632(auVar87));
            fVar169 = auVar93._0_4_;
            fVar168 = auVar93._4_4_;
            fVar161 = auVar93._8_4_;
            fVar162 = auVar93._12_4_;
            local_3a0 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar162,
                                           CONCAT48(auVar89._8_4_ * fVar161,
                                                    CONCAT44(auVar89._4_4_ * fVar168,
                                                             auVar89._0_4_ * fVar169))));
            auVar222 = ZEXT3264(local_3a0);
            uVar163 = vcmpps_avx512vl(local_3a0,auVar220,2);
            uVar21 = vcmpps_avx512vl(local_3a0,local_500,0xd);
            bVar81 = (byte)uVar163 & (byte)uVar21 & bVar81;
            if (bVar81 != 0) {
              uVar82 = vcmpps_avx512vl(ZEXT1632(auVar88),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar82 = bVar81 & uVar82;
              if ((char)uVar82 != '\0') {
                fVar178 = auVar104._0_4_ * fVar169;
                fVar179 = auVar104._4_4_ * fVar168;
                auVar65._4_4_ = fVar179;
                auVar65._0_4_ = fVar178;
                fVar183 = auVar104._8_4_ * fVar161;
                auVar65._8_4_ = fVar183;
                fVar83 = auVar104._12_4_ * fVar162;
                auVar65._12_4_ = fVar83;
                fVar84 = auVar104._16_4_ * 0.0;
                auVar65._16_4_ = fVar84;
                fVar135 = auVar104._20_4_ * 0.0;
                auVar65._20_4_ = fVar135;
                fVar136 = auVar104._24_4_ * 0.0;
                auVar65._24_4_ = fVar136;
                auVar65._28_4_ = auVar104._28_4_;
                auVar100 = vsubps_avx512vl(auVar98,auVar65);
                local_3e0._0_4_ =
                     (float)((uint)(bVar72 & 1) * (int)fVar178 |
                            (uint)!(bool)(bVar72 & 1) * auVar100._0_4_);
                bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
                local_3e0._4_4_ =
                     (float)((uint)bVar13 * (int)fVar179 | (uint)!bVar13 * auVar100._4_4_);
                bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                local_3e0._8_4_ =
                     (float)((uint)bVar13 * (int)fVar183 | (uint)!bVar13 * auVar100._8_4_);
                bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                local_3e0._12_4_ =
                     (float)((uint)bVar13 * (int)fVar83 | (uint)!bVar13 * auVar100._12_4_);
                bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                local_3e0._16_4_ =
                     (float)((uint)bVar13 * (int)fVar84 | (uint)!bVar13 * auVar100._16_4_);
                bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
                local_3e0._20_4_ =
                     (float)((uint)bVar13 * (int)fVar135 | (uint)!bVar13 * auVar100._20_4_);
                bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
                local_3e0._24_4_ =
                     (float)((uint)bVar13 * (int)fVar136 | (uint)!bVar13 * auVar100._24_4_);
                bVar13 = SUB81(uVar73 >> 7,0);
                local_3e0._28_4_ =
                     (float)((uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar100._28_4_);
                auVar100 = vsubps_avx(auVar105,auVar96);
                auVar93 = vfmadd213ps_fma(auVar100,local_3e0,auVar96);
                uVar144 = *(undefined4 *)((long)pre->ray_space + sVar80 * 4 + -0x20);
                auVar30._4_4_ = uVar144;
                auVar30._0_4_ = uVar144;
                auVar30._8_4_ = uVar144;
                auVar30._12_4_ = uVar144;
                auVar30._16_4_ = uVar144;
                auVar30._20_4_ = uVar144;
                auVar30._24_4_ = uVar144;
                auVar30._28_4_ = uVar144;
                auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar93._12_4_ + auVar93._12_4_,
                                                              CONCAT48(auVar93._8_4_ + auVar93._8_4_
                                                                       ,CONCAT44(auVar93._4_4_ +
                                                                                 auVar93._4_4_,
                                                                                 auVar93._0_4_ +
                                                                                 auVar93._0_4_)))),
                                           auVar30);
                uVar76 = vcmpps_avx512vl(local_3a0,auVar100,6);
                uVar82 = uVar82 & uVar76;
                bVar81 = (byte)uVar82;
                if (bVar81 != 0) {
                  auVar167._0_4_ = auVar106._0_4_ * fVar169;
                  auVar167._4_4_ = auVar106._4_4_ * fVar168;
                  auVar167._8_4_ = auVar106._8_4_ * fVar161;
                  auVar167._12_4_ = auVar106._12_4_ * fVar162;
                  auVar167._16_4_ = auVar106._16_4_ * 0.0;
                  auVar167._20_4_ = auVar106._20_4_ * 0.0;
                  auVar167._24_4_ = auVar106._24_4_ * 0.0;
                  auVar167._28_4_ = 0;
                  auVar100 = vsubps_avx512vl(auVar98,auVar167);
                  auVar131._0_4_ =
                       (uint)(bVar72 & 1) * (int)auVar167._0_4_ |
                       (uint)!(bool)(bVar72 & 1) * auVar100._0_4_;
                  bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
                  auVar131._4_4_ =
                       (uint)bVar13 * (int)auVar167._4_4_ | (uint)!bVar13 * auVar100._4_4_;
                  bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                  auVar131._8_4_ =
                       (uint)bVar13 * (int)auVar167._8_4_ | (uint)!bVar13 * auVar100._8_4_;
                  bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                  auVar131._12_4_ =
                       (uint)bVar13 * (int)auVar167._12_4_ | (uint)!bVar13 * auVar100._12_4_;
                  bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                  auVar131._16_4_ =
                       (uint)bVar13 * (int)auVar167._16_4_ | (uint)!bVar13 * auVar100._16_4_;
                  bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
                  auVar131._20_4_ =
                       (uint)bVar13 * (int)auVar167._20_4_ | (uint)!bVar13 * auVar100._20_4_;
                  bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
                  auVar131._24_4_ =
                       (uint)bVar13 * (int)auVar167._24_4_ | (uint)!bVar13 * auVar100._24_4_;
                  auVar131._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar100._28_4_;
                  auVar31._8_4_ = 0x40000000;
                  auVar31._0_8_ = 0x4000000040000000;
                  auVar31._12_4_ = 0x40000000;
                  auVar31._16_4_ = 0x40000000;
                  auVar31._20_4_ = 0x40000000;
                  auVar31._24_4_ = 0x40000000;
                  auVar31._28_4_ = 0x40000000;
                  local_3c0 = vfmsub132ps_avx512vl(auVar131,auVar98,auVar31);
                  local_380 = (undefined4)lVar77;
                  local_360 = local_660;
                  uStack_358 = uStack_658;
                  local_350 = local_670;
                  uStack_348 = uStack_668;
                  local_340 = local_680;
                  uStack_338 = uStack_678;
                  pGVar11 = (context->scene->geometries).items[uVar78].ptr;
                  if ((pGVar11->mask & *(uint *)(ray + sVar80 * 4 + 0x120)) != 0) {
                    auVar93 = vcvtsi2ss_avx512f(auVar92,local_380);
                    fVar169 = auVar93._0_4_;
                    local_320[0] = (fVar169 + local_3e0._0_4_ + 0.0) * local_100;
                    local_320[1] = (fVar169 + local_3e0._4_4_ + 1.0) * fStack_fc;
                    local_320[2] = (fVar169 + local_3e0._8_4_ + 2.0) * fStack_f8;
                    local_320[3] = (fVar169 + local_3e0._12_4_ + 3.0) * fStack_f4;
                    fStack_310 = (fVar169 + local_3e0._16_4_ + 4.0) * fStack_f0;
                    fStack_30c = (fVar169 + local_3e0._20_4_ + 5.0) * fStack_ec;
                    fStack_308 = (fVar169 + local_3e0._24_4_ + 6.0) * fStack_e8;
                    fStack_304 = fVar169 + local_3e0._28_4_ + 7.0;
                    local_300 = local_3c0;
                    local_2e0 = local_3a0;
                    auVar153._8_4_ = 0x7f800000;
                    auVar153._0_8_ = 0x7f8000007f800000;
                    auVar153._12_4_ = 0x7f800000;
                    auVar153._16_4_ = 0x7f800000;
                    auVar153._20_4_ = 0x7f800000;
                    auVar153._24_4_ = 0x7f800000;
                    auVar153._28_4_ = 0x7f800000;
                    auVar100 = vblendmps_avx512vl(auVar153,local_3a0);
                    auVar132._0_4_ =
                         (uint)(bVar81 & 1) * auVar100._0_4_ |
                         (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar82 >> 1) & 1);
                    auVar132._4_4_ = (uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar82 >> 2) & 1);
                    auVar132._8_4_ = (uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar82 >> 3) & 1);
                    auVar132._12_4_ = (uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar82 >> 4) & 1);
                    auVar132._16_4_ = (uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar82 >> 5) & 1);
                    auVar132._20_4_ = (uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar82 >> 6) & 1);
                    auVar132._24_4_ = (uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar82 >> 7,0);
                    auVar132._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar100 = vshufps_avx(auVar132,auVar132,0xb1);
                    auVar100 = vminps_avx(auVar132,auVar100);
                    auVar97 = vshufpd_avx(auVar100,auVar100,5);
                    auVar100 = vminps_avx(auVar100,auVar97);
                    auVar97 = vpermpd_avx2(auVar100,0x4e);
                    auVar100 = vminps_avx(auVar100,auVar97);
                    uVar163 = vcmpps_avx512vl(auVar132,auVar100,0);
                    uVar74 = (uint)uVar82;
                    if (((byte)uVar163 & bVar81) != 0) {
                      uVar74 = (uint)((byte)uVar163 & bVar81);
                    }
                    uVar75 = 0;
                    for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                      uVar75 = uVar75 + 1;
                    }
                    uVar73 = (ulong)uVar75;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_2c0 = local_3a0;
                      local_37c = iVar9;
                      local_370 = auVar85;
                      do {
                        fVar169 = local_320[uVar73];
                        auVar164._4_4_ = fVar169;
                        auVar164._0_4_ = fVar169;
                        auVar164._8_4_ = fVar169;
                        auVar164._12_4_ = fVar169;
                        local_1c0._16_4_ = fVar169;
                        local_1c0._0_16_ = auVar164;
                        local_1c0._20_4_ = fVar169;
                        local_1c0._24_4_ = fVar169;
                        local_1c0._28_4_ = fVar169;
                        local_1a0 = *(undefined4 *)(local_300 + uVar73 * 4);
                        *(undefined4 *)(ray + sVar80 * 4 + 0x100) =
                             *(undefined4 *)(local_2e0 + uVar73 * 4);
                        local_650.context = context->user;
                        fVar168 = 1.0 - fVar169;
                        auVar25._8_4_ = 0x80000000;
                        auVar25._0_8_ = 0x8000000080000000;
                        auVar25._12_4_ = 0x80000000;
                        auVar89 = vxorps_avx512vl(ZEXT416((uint)fVar168),auVar25);
                        auVar93 = ZEXT416((uint)(fVar169 * fVar168 * 4.0));
                        auVar88 = vfnmsub213ss_fma(auVar164,auVar164,auVar93);
                        auVar93 = vfmadd213ss_fma(ZEXT416((uint)fVar168),ZEXT416((uint)fVar168),
                                                  auVar93);
                        auVar206 = ZEXT464(0x3f000000);
                        fVar168 = fVar168 * auVar89._0_4_ * 0.5;
                        fVar161 = auVar88._0_4_ * 0.5;
                        fVar162 = auVar93._0_4_ * 0.5;
                        fVar169 = fVar169 * fVar169 * 0.5;
                        auVar197._0_4_ = fVar169 * fVar143;
                        auVar197._4_4_ = fVar169 * fVar158;
                        auVar197._8_4_ = fVar169 * fVar159;
                        auVar197._12_4_ = fVar169 * fVar160;
                        auVar145._4_4_ = fVar162;
                        auVar145._0_4_ = fVar162;
                        auVar145._8_4_ = fVar162;
                        auVar145._12_4_ = fVar162;
                        auVar93 = vfmadd132ps_fma(auVar145,auVar197,auVar6);
                        auVar188._4_4_ = fVar161;
                        auVar188._0_4_ = fVar161;
                        auVar188._8_4_ = fVar161;
                        auVar188._12_4_ = fVar161;
                        auVar93 = vfmadd132ps_fma(auVar188,auVar93,auVar20);
                        auVar146._4_4_ = fVar168;
                        auVar146._0_4_ = fVar168;
                        auVar146._8_4_ = fVar168;
                        auVar146._12_4_ = fVar168;
                        auVar93 = vfmadd213ps_fma(auVar146,auVar85,auVar93);
                        local_220 = auVar93._0_4_;
                        auVar194._8_4_ = 1;
                        auVar194._0_8_ = 0x100000001;
                        auVar194._12_4_ = 1;
                        auVar194._16_4_ = 1;
                        auVar194._20_4_ = 1;
                        auVar194._24_4_ = 1;
                        auVar194._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar194,ZEXT1632(auVar93));
                        auVar196 = ZEXT3264(local_200);
                        auVar198._8_4_ = 2;
                        auVar198._0_8_ = 0x200000002;
                        auVar198._12_4_ = 2;
                        auVar201._16_4_ = 2;
                        auVar201._0_16_ = auVar198;
                        auVar201._20_4_ = 2;
                        auVar201._24_4_ = 2;
                        auVar201._28_4_ = 2;
                        auVar203 = ZEXT3264(auVar201);
                        local_1e0 = vpermps_avx2(auVar201,ZEXT1632(auVar93));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_580._0_8_;
                        uStack_178 = local_580._8_8_;
                        uStack_170 = local_580._16_8_;
                        uStack_168 = local_580._24_8_;
                        local_160 = local_520;
                        auVar100 = vpcmpeqd_avx2(local_520,local_520);
                        local_608[1] = auVar100;
                        *local_608 = auVar100;
                        local_140 = (local_650.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_650.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_600 = local_2a0;
                        local_650.valid = (int *)local_600;
                        local_650.geometryUserPtr = pGVar11->userPtr;
                        local_650.hit = (RTCHitN *)&local_220;
                        local_650.N = 8;
                        local_5a0 = auVar210._0_32_;
                        local_620._0_4_ = (int)uVar82;
                        local_650.ray = (RTCRayN *)ray;
                        if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar196 = ZEXT1664(local_200._0_16_);
                          auVar203 = ZEXT1664(auVar198);
                          auVar206 = ZEXT1664(auVar206._0_16_);
                          (*pGVar11->intersectionFilterN)(&local_650);
                          uVar82 = (ulong)(uint)local_620._0_4_;
                          auVar222 = ZEXT3264(local_2c0);
                          auVar210 = ZEXT3264(local_5a0);
                        }
                        bVar81 = (byte)uVar82;
                        if (local_600 == (undefined1  [32])0x0) {
LAB_01cbe15a:
                          *(int *)(ray + sVar80 * 4 + 0x100) = auVar210._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar196 = ZEXT1664(auVar196._0_16_);
                            auVar203 = ZEXT1664(auVar203._0_16_);
                            auVar206 = ZEXT1664(auVar206._0_16_);
                            (*p_Var12)(&local_650);
                            bVar81 = local_620[0];
                            auVar222 = ZEXT3264(local_2c0);
                            auVar210 = ZEXT3264(local_5a0);
                          }
                          if (local_600 == (undefined1  [32])0x0) goto LAB_01cbe15a;
                          uVar82 = vptestmd_avx512vl(local_600,local_600);
                          iVar1 = *(int *)(local_650.hit + 4);
                          iVar2 = *(int *)(local_650.hit + 8);
                          iVar67 = *(int *)(local_650.hit + 0xc);
                          iVar68 = *(int *)(local_650.hit + 0x10);
                          iVar69 = *(int *)(local_650.hit + 0x14);
                          iVar70 = *(int *)(local_650.hit + 0x18);
                          iVar71 = *(int *)(local_650.hit + 0x1c);
                          bVar72 = (byte)uVar82;
                          bVar13 = (bool)((byte)(uVar82 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar82 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar82 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar82 >> 6) & 1);
                          bVar19 = SUB81(uVar82 >> 7,0);
                          *(uint *)(local_650.ray + 0x180) =
                               (uint)(bVar72 & 1) * *(int *)local_650.hit |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_650.ray + 0x180);
                          *(uint *)(local_650.ray + 0x184) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x184);
                          *(uint *)(local_650.ray + 0x188) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x188);
                          *(uint *)(local_650.ray + 0x18c) =
                               (uint)bVar15 * iVar67 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x18c);
                          *(uint *)(local_650.ray + 400) =
                               (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_650.ray + 400)
                          ;
                          *(uint *)(local_650.ray + 0x194) =
                               (uint)bVar17 * iVar69 |
                               (uint)!bVar17 * *(int *)(local_650.ray + 0x194);
                          *(uint *)(local_650.ray + 0x198) =
                               (uint)bVar18 * iVar70 |
                               (uint)!bVar18 * *(int *)(local_650.ray + 0x198);
                          *(uint *)(local_650.ray + 0x19c) =
                               (uint)bVar19 * iVar71 |
                               (uint)!bVar19 * *(int *)(local_650.ray + 0x19c);
                          iVar1 = *(int *)(local_650.hit + 0x24);
                          iVar2 = *(int *)(local_650.hit + 0x28);
                          iVar67 = *(int *)(local_650.hit + 0x2c);
                          iVar68 = *(int *)(local_650.hit + 0x30);
                          iVar69 = *(int *)(local_650.hit + 0x34);
                          iVar70 = *(int *)(local_650.hit + 0x38);
                          iVar71 = *(int *)(local_650.hit + 0x3c);
                          bVar13 = (bool)((byte)(uVar82 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar82 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar82 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar82 >> 6) & 1);
                          bVar19 = SUB81(uVar82 >> 7,0);
                          *(uint *)(local_650.ray + 0x1a0) =
                               (uint)(bVar72 & 1) * *(int *)(local_650.hit + 0x20) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_650.ray + 0x1a0);
                          *(uint *)(local_650.ray + 0x1a4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x1a4);
                          *(uint *)(local_650.ray + 0x1a8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x1a8);
                          *(uint *)(local_650.ray + 0x1ac) =
                               (uint)bVar15 * iVar67 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x1ac);
                          *(uint *)(local_650.ray + 0x1b0) =
                               (uint)bVar16 * iVar68 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x1b0);
                          *(uint *)(local_650.ray + 0x1b4) =
                               (uint)bVar17 * iVar69 |
                               (uint)!bVar17 * *(int *)(local_650.ray + 0x1b4);
                          *(uint *)(local_650.ray + 0x1b8) =
                               (uint)bVar18 * iVar70 |
                               (uint)!bVar18 * *(int *)(local_650.ray + 0x1b8);
                          *(uint *)(local_650.ray + 0x1bc) =
                               (uint)bVar19 * iVar71 |
                               (uint)!bVar19 * *(int *)(local_650.ray + 0x1bc);
                          iVar1 = *(int *)(local_650.hit + 0x44);
                          iVar2 = *(int *)(local_650.hit + 0x48);
                          iVar67 = *(int *)(local_650.hit + 0x4c);
                          iVar68 = *(int *)(local_650.hit + 0x50);
                          iVar69 = *(int *)(local_650.hit + 0x54);
                          iVar70 = *(int *)(local_650.hit + 0x58);
                          iVar71 = *(int *)(local_650.hit + 0x5c);
                          bVar13 = (bool)((byte)(uVar82 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar82 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar82 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar82 >> 6) & 1);
                          bVar19 = SUB81(uVar82 >> 7,0);
                          *(uint *)(local_650.ray + 0x1c0) =
                               (uint)(bVar72 & 1) * *(int *)(local_650.hit + 0x40) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_650.ray + 0x1c0);
                          *(uint *)(local_650.ray + 0x1c4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x1c4);
                          *(uint *)(local_650.ray + 0x1c8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x1c8);
                          *(uint *)(local_650.ray + 0x1cc) =
                               (uint)bVar15 * iVar67 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x1cc);
                          *(uint *)(local_650.ray + 0x1d0) =
                               (uint)bVar16 * iVar68 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x1d0);
                          *(uint *)(local_650.ray + 0x1d4) =
                               (uint)bVar17 * iVar69 |
                               (uint)!bVar17 * *(int *)(local_650.ray + 0x1d4);
                          *(uint *)(local_650.ray + 0x1d8) =
                               (uint)bVar18 * iVar70 |
                               (uint)!bVar18 * *(int *)(local_650.ray + 0x1d8);
                          *(uint *)(local_650.ray + 0x1dc) =
                               (uint)bVar19 * iVar71 |
                               (uint)!bVar19 * *(int *)(local_650.ray + 0x1dc);
                          iVar1 = *(int *)(local_650.hit + 100);
                          iVar2 = *(int *)(local_650.hit + 0x68);
                          iVar67 = *(int *)(local_650.hit + 0x6c);
                          iVar68 = *(int *)(local_650.hit + 0x70);
                          iVar69 = *(int *)(local_650.hit + 0x74);
                          iVar70 = *(int *)(local_650.hit + 0x78);
                          iVar71 = *(int *)(local_650.hit + 0x7c);
                          bVar13 = (bool)((byte)(uVar82 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar82 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar82 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar82 >> 6) & 1);
                          bVar19 = SUB81(uVar82 >> 7,0);
                          *(uint *)(local_650.ray + 0x1e0) =
                               (uint)(bVar72 & 1) * *(int *)(local_650.hit + 0x60) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_650.ray + 0x1e0);
                          *(uint *)(local_650.ray + 0x1e4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x1e4);
                          *(uint *)(local_650.ray + 0x1e8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x1e8);
                          *(uint *)(local_650.ray + 0x1ec) =
                               (uint)bVar15 * iVar67 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x1ec);
                          *(uint *)(local_650.ray + 0x1f0) =
                               (uint)bVar16 * iVar68 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x1f0);
                          *(uint *)(local_650.ray + 500) =
                               (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_650.ray + 500)
                          ;
                          *(uint *)(local_650.ray + 0x1f8) =
                               (uint)bVar18 * iVar70 |
                               (uint)!bVar18 * *(int *)(local_650.ray + 0x1f8);
                          *(uint *)(local_650.ray + 0x1fc) =
                               (uint)bVar19 * iVar71 |
                               (uint)!bVar19 * *(int *)(local_650.ray + 0x1fc);
                          iVar1 = *(int *)(local_650.hit + 0x84);
                          iVar2 = *(int *)(local_650.hit + 0x88);
                          iVar67 = *(int *)(local_650.hit + 0x8c);
                          iVar68 = *(int *)(local_650.hit + 0x90);
                          iVar69 = *(int *)(local_650.hit + 0x94);
                          iVar70 = *(int *)(local_650.hit + 0x98);
                          iVar71 = *(int *)(local_650.hit + 0x9c);
                          bVar13 = (bool)((byte)(uVar82 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar82 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar82 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar82 >> 6) & 1);
                          bVar19 = SUB81(uVar82 >> 7,0);
                          *(uint *)(local_650.ray + 0x200) =
                               (uint)(bVar72 & 1) * *(int *)(local_650.hit + 0x80) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_650.ray + 0x200);
                          *(uint *)(local_650.ray + 0x204) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x204);
                          *(uint *)(local_650.ray + 0x208) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x208);
                          *(uint *)(local_650.ray + 0x20c) =
                               (uint)bVar15 * iVar67 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x20c);
                          *(uint *)(local_650.ray + 0x210) =
                               (uint)bVar16 * iVar68 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x210);
                          *(uint *)(local_650.ray + 0x214) =
                               (uint)bVar17 * iVar69 |
                               (uint)!bVar17 * *(int *)(local_650.ray + 0x214);
                          *(uint *)(local_650.ray + 0x218) =
                               (uint)bVar18 * iVar70 |
                               (uint)!bVar18 * *(int *)(local_650.ray + 0x218);
                          *(uint *)(local_650.ray + 0x21c) =
                               (uint)bVar19 * iVar71 |
                               (uint)!bVar19 * *(int *)(local_650.ray + 0x21c);
                          auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_650.ray + 0x220) = auVar100;
                          auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_650.ray + 0x240) = auVar100;
                          auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_650.ray + 0x260) = auVar100;
                          auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_650.hit + 0x100));
                          *(undefined1 (*) [32])(local_650.ray + 0x280) = auVar100;
                          auVar210 = ZEXT464(*(uint *)(ray + sVar80 * 4 + 0x100));
                        }
                        bVar81 = ~(byte)(1 << ((uint)uVar73 & 0x1f)) & bVar81;
                        uVar144 = auVar210._0_4_;
                        auVar154._4_4_ = uVar144;
                        auVar154._0_4_ = uVar144;
                        auVar154._8_4_ = uVar144;
                        auVar154._12_4_ = uVar144;
                        auVar154._16_4_ = uVar144;
                        auVar154._20_4_ = uVar144;
                        auVar154._24_4_ = uVar144;
                        auVar154._28_4_ = uVar144;
                        uVar163 = vcmpps_avx512vl(auVar222._0_32_,auVar154,2);
                        if ((bVar81 & (byte)uVar163) == 0) goto LAB_01cbe1ea;
                        bVar81 = bVar81 & (byte)uVar163;
                        uVar82 = (ulong)bVar81;
                        auVar155._8_4_ = 0x7f800000;
                        auVar155._0_8_ = 0x7f8000007f800000;
                        auVar155._12_4_ = 0x7f800000;
                        auVar155._16_4_ = 0x7f800000;
                        auVar155._20_4_ = 0x7f800000;
                        auVar155._24_4_ = 0x7f800000;
                        auVar155._28_4_ = 0x7f800000;
                        auVar100 = vblendmps_avx512vl(auVar155,auVar222._0_32_);
                        auVar133._0_4_ =
                             (uint)(bVar81 & 1) * auVar100._0_4_ |
                             (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 1 & 1);
                        auVar133._4_4_ = (uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 2 & 1);
                        auVar133._8_4_ = (uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 3 & 1);
                        auVar133._12_4_ =
                             (uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 4 & 1);
                        auVar133._16_4_ =
                             (uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 5 & 1);
                        auVar133._20_4_ =
                             (uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 6 & 1);
                        auVar133._24_4_ =
                             (uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar133._28_4_ =
                             (uint)(bVar81 >> 7) * auVar100._28_4_ |
                             (uint)!(bool)(bVar81 >> 7) * 0x7f800000;
                        auVar100 = vshufps_avx(auVar133,auVar133,0xb1);
                        auVar100 = vminps_avx(auVar133,auVar100);
                        auVar97 = vshufpd_avx(auVar100,auVar100,5);
                        auVar100 = vminps_avx(auVar100,auVar97);
                        auVar97 = vpermpd_avx2(auVar100,0x4e);
                        auVar100 = vminps_avx(auVar100,auVar97);
                        uVar163 = vcmpps_avx512vl(auVar133,auVar100,0);
                        bVar72 = (byte)uVar163 & bVar81;
                        if (bVar72 != 0) {
                          bVar81 = bVar72;
                        }
                        uVar74 = 0;
                        for (uVar75 = (uint)bVar81; (uVar75 & 1) == 0;
                            uVar75 = uVar75 >> 1 | 0x80000000) {
                          uVar74 = uVar74 + 1;
                        }
                        uVar73 = (ulong)uVar74;
                      } while( true );
                    }
                    fVar169 = local_320[uVar73];
                    uVar144 = *(undefined4 *)(local_300 + uVar73 * 4);
                    fVar168 = 1.0 - fVar169;
                    auVar24._8_4_ = 0x80000000;
                    auVar24._0_8_ = 0x8000000080000000;
                    auVar24._12_4_ = 0x80000000;
                    auVar89 = vxorps_avx512vl(ZEXT416((uint)fVar168),auVar24);
                    auVar93 = ZEXT416((uint)(fVar169 * fVar168 * 4.0));
                    auVar88 = vfnmsub213ss_fma(ZEXT416((uint)fVar169),ZEXT416((uint)fVar169),auVar93
                                              );
                    auVar93 = vfmadd213ss_fma(ZEXT416((uint)fVar168),ZEXT416((uint)fVar168),auVar93)
                    ;
                    fVar168 = fVar168 * auVar89._0_4_ * 0.5;
                    fVar161 = auVar88._0_4_ * 0.5;
                    auVar203 = ZEXT464((uint)fVar161);
                    fVar162 = auVar93._0_4_ * 0.5;
                    fVar178 = fVar169 * fVar169 * 0.5;
                    auVar186._0_4_ = fVar178 * fVar143;
                    auVar186._4_4_ = fVar178 * fVar158;
                    auVar186._8_4_ = fVar178 * fVar159;
                    auVar186._12_4_ = fVar178 * fVar160;
                    auVar174._4_4_ = fVar162;
                    auVar174._0_4_ = fVar162;
                    auVar174._8_4_ = fVar162;
                    auVar174._12_4_ = fVar162;
                    auVar93 = vfmadd132ps_fma(auVar174,auVar186,auVar6);
                    auVar187._4_4_ = fVar161;
                    auVar187._0_4_ = fVar161;
                    auVar187._8_4_ = fVar161;
                    auVar187._12_4_ = fVar161;
                    auVar93 = vfmadd132ps_fma(auVar187,auVar93,auVar20);
                    auVar196 = ZEXT1664(auVar93);
                    auVar175._4_4_ = fVar168;
                    auVar175._0_4_ = fVar168;
                    auVar175._8_4_ = fVar168;
                    auVar175._12_4_ = fVar168;
                    auVar93 = vfmadd213ps_fma(auVar175,auVar85,auVar93);
                    *(undefined4 *)(ray + sVar80 * 4 + 0x100) =
                         *(undefined4 *)(local_2e0 + uVar73 * 4);
                    *(int *)(ray + sVar80 * 4 + 0x180) = auVar93._0_4_;
                    uVar10 = vextractps_avx(auVar93,1);
                    *(undefined4 *)(ray + sVar80 * 4 + 0x1a0) = uVar10;
                    uVar10 = vextractps_avx(auVar93,2);
                    *(undefined4 *)(ray + sVar80 * 4 + 0x1c0) = uVar10;
                    *(float *)(ray + sVar80 * 4 + 0x1e0) = fVar169;
                    *(undefined4 *)(ray + sVar80 * 4 + 0x200) = uVar144;
                    *(undefined4 *)(ray + sVar80 * 4 + 0x220) = uVar3;
                    *(uint *)(ray + sVar80 * 4 + 0x240) = uVar78;
                    *(uint *)(ray + sVar80 * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + sVar80 * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01cbde21;
      }
LAB_01cbd4a2:
      uVar3 = *(undefined4 *)(ray + sVar80 * 4 + 0x100);
      auVar29._4_4_ = uVar3;
      auVar29._0_4_ = uVar3;
      auVar29._8_4_ = uVar3;
      auVar29._12_4_ = uVar3;
      auVar29._16_4_ = uVar3;
      auVar29._20_4_ = uVar3;
      auVar29._24_4_ = uVar3;
      auVar29._28_4_ = uVar3;
      uVar163 = vcmpps_avx512vl(auVar224._0_32_,auVar29,2);
      uVar78 = (uint)uVar79 & (uint)uVar163;
      uVar79 = (ulong)uVar78;
    } while (uVar78 != 0);
  }
  return;
LAB_01cbe1ea:
  auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar223 = ZEXT3264(auVar100);
  auVar224 = ZEXT3264(local_540);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar225 = ZEXT1664(auVar93);
LAB_01cbde21:
  lVar77 = lVar77 + 8;
  if (iVar9 <= (int)lVar77) goto LAB_01cbd4a2;
  goto LAB_01cbd543;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }